

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  byte bVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uint uVar36;
  ulong uVar37;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar72 [32];
  undefined1 auVar51 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar54 [16];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  int iVar101;
  float t1;
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  undefined4 uVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar127;
  float fVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar137;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  vfloat4 b0;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  vfloat4 b0_1;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar157 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  vfloat4 a0_2;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar195;
  float fVar208;
  float fVar209;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar216;
  float fVar224;
  float fVar225;
  vfloat4 a0_1;
  float fVar226;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar227;
  float fVar235;
  float fVar236;
  vfloat4 a0;
  float fVar237;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  int iVar255;
  undefined1 in_ZMM30 [64];
  undefined1 auVar256 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar257 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined8 local_388;
  undefined8 uStack_380;
  RTCFilterFunctionNArguments local_378;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  uint auStack_2f8 [4];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint uStack_168;
  float afStack_164 [7];
  RTCHitN local_148 [16];
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar31;
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar234 [32];
  
  PVar3 = prim[1];
  uVar35 = (ulong)(byte)PVar3;
  fVar128 = *(float *)(prim + uVar35 * 0x19 + 0x12);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar103 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar40 = vsubps_avx(auVar38,*(undefined1 (*) [16])(prim + uVar35 * 0x19 + 6));
  fVar127 = fVar128 * auVar40._0_4_;
  fVar102 = fVar128 * auVar103._0_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar35 * 4 + 6);
  auVar69 = vpmovsxbd_avx2(auVar38);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar35 * 5 + 6);
  auVar67 = vpmovsxbd_avx2(auVar50);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar35 * 6 + 6);
  auVar74 = vpmovsxbd_avx2(auVar49);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar35 * 0xb + 6);
  auVar84 = vpmovsxbd_avx2(auVar48);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  auVar78 = vpmovsxbd_avx2(auVar47);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vcvtdq2ps_avx(auVar78);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + (uint)(byte)PVar3 * 0xc + uVar35 + 6);
  auVar68 = vpmovsxbd_avx2(auVar46);
  auVar68 = vcvtdq2ps_avx(auVar68);
  uVar37 = (ulong)(uint)((int)(uVar35 * 9) * 2);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar37 + 6);
  auVar75 = vpmovsxbd_avx2(auVar45);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar37 + uVar35 + 6);
  auVar76 = vpmovsxbd_avx2(auVar44);
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar30 = (ulong)(uint)((int)(uVar35 * 5) << 2);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar30 + 6);
  auVar66 = vpmovsxbd_avx2(auVar43);
  auVar77 = vcvtdq2ps_avx(auVar66);
  auVar143._4_4_ = fVar102;
  auVar143._0_4_ = fVar102;
  auVar143._8_4_ = fVar102;
  auVar143._12_4_ = fVar102;
  auVar143._16_4_ = fVar102;
  auVar143._20_4_ = fVar102;
  auVar143._24_4_ = fVar102;
  auVar143._28_4_ = fVar102;
  auVar246._8_4_ = 1;
  auVar246._0_8_ = 0x100000001;
  auVar246._12_4_ = 1;
  auVar246._16_4_ = 1;
  auVar246._20_4_ = 1;
  auVar246._24_4_ = 1;
  auVar246._28_4_ = 1;
  auVar64 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar254 = ZEXT3264(auVar64);
  auVar80 = ZEXT1632(CONCAT412(fVar128 * auVar103._12_4_,
                               CONCAT48(fVar128 * auVar103._8_4_,
                                        CONCAT44(fVar128 * auVar103._4_4_,fVar102))));
  auVar79 = vpermps_avx2(auVar246,auVar80);
  auVar65 = vpermps_avx512vl(auVar64,auVar80);
  fVar102 = auVar65._0_4_;
  fVar195 = auVar65._4_4_;
  auVar80._4_4_ = fVar195 * auVar74._4_4_;
  auVar80._0_4_ = fVar102 * auVar74._0_4_;
  fVar208 = auVar65._8_4_;
  auVar80._8_4_ = fVar208 * auVar74._8_4_;
  fVar209 = auVar65._12_4_;
  auVar80._12_4_ = fVar209 * auVar74._12_4_;
  fVar105 = auVar65._16_4_;
  auVar80._16_4_ = fVar105 * auVar74._16_4_;
  fVar106 = auVar65._20_4_;
  auVar80._20_4_ = fVar106 * auVar74._20_4_;
  fVar107 = auVar65._24_4_;
  auVar80._24_4_ = fVar107 * auVar74._24_4_;
  auVar80._28_4_ = auVar78._28_4_;
  auVar78._4_4_ = auVar68._4_4_ * fVar195;
  auVar78._0_4_ = auVar68._0_4_ * fVar102;
  auVar78._8_4_ = auVar68._8_4_ * fVar208;
  auVar78._12_4_ = auVar68._12_4_ * fVar209;
  auVar78._16_4_ = auVar68._16_4_ * fVar105;
  auVar78._20_4_ = auVar68._20_4_ * fVar106;
  auVar78._24_4_ = auVar68._24_4_ * fVar107;
  auVar78._28_4_ = auVar66._28_4_;
  auVar66._4_4_ = auVar77._4_4_ * fVar195;
  auVar66._0_4_ = auVar77._0_4_ * fVar102;
  auVar66._8_4_ = auVar77._8_4_ * fVar208;
  auVar66._12_4_ = auVar77._12_4_ * fVar209;
  auVar66._16_4_ = auVar77._16_4_ * fVar105;
  auVar66._20_4_ = auVar77._20_4_ * fVar106;
  auVar66._24_4_ = auVar77._24_4_ * fVar107;
  auVar66._28_4_ = auVar65._28_4_;
  auVar38 = vfmadd231ps_fma(auVar80,auVar79,auVar67);
  auVar50 = vfmadd231ps_fma(auVar78,auVar79,auVar85);
  auVar49 = vfmadd231ps_fma(auVar66,auVar76,auVar79);
  auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar143,auVar69);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar143,auVar84);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar75,auVar143);
  auVar233._4_4_ = fVar127;
  auVar233._0_4_ = fVar127;
  auVar233._8_4_ = fVar127;
  auVar233._12_4_ = fVar127;
  auVar233._16_4_ = fVar127;
  auVar233._20_4_ = fVar127;
  auVar233._24_4_ = fVar127;
  auVar233._28_4_ = fVar127;
  auVar66 = ZEXT1632(CONCAT412(fVar128 * auVar40._12_4_,
                               CONCAT48(fVar128 * auVar40._8_4_,
                                        CONCAT44(fVar128 * auVar40._4_4_,fVar127))));
  auVar78 = vpermps_avx2(auVar246,auVar66);
  auVar66 = vpermps_avx512vl(auVar64,auVar66);
  fVar128 = auVar66._0_4_;
  fVar102 = auVar66._4_4_;
  auVar79._4_4_ = fVar102 * auVar74._4_4_;
  auVar79._0_4_ = fVar128 * auVar74._0_4_;
  fVar195 = auVar66._8_4_;
  auVar79._8_4_ = fVar195 * auVar74._8_4_;
  fVar208 = auVar66._12_4_;
  auVar79._12_4_ = fVar208 * auVar74._12_4_;
  fVar209 = auVar66._16_4_;
  auVar79._16_4_ = fVar209 * auVar74._16_4_;
  fVar105 = auVar66._20_4_;
  auVar79._20_4_ = fVar105 * auVar74._20_4_;
  fVar106 = auVar66._24_4_;
  auVar79._24_4_ = fVar106 * auVar74._24_4_;
  auVar79._28_4_ = 1;
  auVar64._4_4_ = auVar68._4_4_ * fVar102;
  auVar64._0_4_ = auVar68._0_4_ * fVar128;
  auVar64._8_4_ = auVar68._8_4_ * fVar195;
  auVar64._12_4_ = auVar68._12_4_ * fVar208;
  auVar64._16_4_ = auVar68._16_4_ * fVar209;
  auVar64._20_4_ = auVar68._20_4_ * fVar105;
  auVar64._24_4_ = auVar68._24_4_ * fVar106;
  auVar64._28_4_ = auVar74._28_4_;
  auVar68._4_4_ = auVar77._4_4_ * fVar102;
  auVar68._0_4_ = auVar77._0_4_ * fVar128;
  auVar68._8_4_ = auVar77._8_4_ * fVar195;
  auVar68._12_4_ = auVar77._12_4_ * fVar208;
  auVar68._16_4_ = auVar77._16_4_ * fVar209;
  auVar68._20_4_ = auVar77._20_4_ * fVar105;
  auVar68._24_4_ = auVar77._24_4_ * fVar106;
  auVar68._28_4_ = auVar66._28_4_;
  auVar48 = vfmadd231ps_fma(auVar79,auVar78,auVar67);
  auVar47 = vfmadd231ps_fma(auVar64,auVar78,auVar85);
  auVar46 = vfmadd231ps_fma(auVar68,auVar78,auVar76);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar233,auVar69);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar233,auVar84);
  auVar87._8_4_ = 0x7fffffff;
  auVar87._0_8_ = 0x7fffffff7fffffff;
  auVar87._12_4_ = 0x7fffffff;
  auVar87._16_4_ = 0x7fffffff;
  auVar87._20_4_ = 0x7fffffff;
  auVar87._24_4_ = 0x7fffffff;
  auVar87._28_4_ = 0x7fffffff;
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar233,auVar75);
  auVar69 = vandps_avx(ZEXT1632(auVar38),auVar87);
  auVar134._8_4_ = 0x219392ef;
  auVar134._0_8_ = 0x219392ef219392ef;
  auVar134._12_4_ = 0x219392ef;
  auVar134._16_4_ = 0x219392ef;
  auVar134._20_4_ = 0x219392ef;
  auVar134._24_4_ = 0x219392ef;
  auVar134._28_4_ = 0x219392ef;
  uVar37 = vcmpps_avx512vl(auVar69,auVar134,1);
  bVar12 = (bool)((byte)uVar37 & 1);
  auVar65._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar38._0_4_;
  bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar38._4_4_;
  bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar38._8_4_;
  bVar12 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar38._12_4_;
  auVar65._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * 0x219392ef;
  auVar65._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * 0x219392ef;
  auVar65._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * 0x219392ef;
  auVar65._28_4_ = (uint)(byte)(uVar37 >> 7) * 0x219392ef;
  auVar69 = vandps_avx(ZEXT1632(auVar50),auVar87);
  uVar37 = vcmpps_avx512vl(auVar69,auVar134,1);
  bVar12 = (bool)((byte)uVar37 & 1);
  auVar81._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar50._0_4_;
  bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar50._4_4_;
  bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar50._8_4_;
  bVar12 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar50._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar37 >> 7) * 0x219392ef;
  auVar69 = vandps_avx(ZEXT1632(auVar49),auVar87);
  uVar37 = vcmpps_avx512vl(auVar69,auVar134,1);
  bVar12 = (bool)((byte)uVar37 & 1);
  auVar69._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar49._0_4_;
  bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar49._4_4_;
  bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar49._8_4_;
  bVar12 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar49._12_4_;
  auVar69._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * 0x219392ef;
  auVar69._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * 0x219392ef;
  auVar69._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * 0x219392ef;
  auVar69._28_4_ = (uint)(byte)(uVar37 >> 7) * 0x219392ef;
  auVar67 = vrcp14ps_avx512vl(auVar65);
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = &DAT_3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  auVar88._16_4_ = 0x3f800000;
  auVar88._20_4_ = 0x3f800000;
  auVar88._24_4_ = 0x3f800000;
  auVar88._28_4_ = 0x3f800000;
  auVar38 = vfnmadd213ps_fma(auVar65,auVar67,auVar88);
  auVar38 = vfmadd132ps_fma(ZEXT1632(auVar38),auVar67,auVar67);
  auVar67 = vrcp14ps_avx512vl(auVar81);
  auVar50 = vfnmadd213ps_fma(auVar81,auVar67,auVar88);
  auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar67,auVar67);
  auVar67 = vrcp14ps_avx512vl(auVar69);
  auVar49 = vfnmadd213ps_fma(auVar69,auVar67,auVar88);
  auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar67,auVar67);
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 7 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar48));
  auVar75._4_4_ = auVar38._4_4_ * auVar69._4_4_;
  auVar75._0_4_ = auVar38._0_4_ * auVar69._0_4_;
  auVar75._8_4_ = auVar38._8_4_ * auVar69._8_4_;
  auVar75._12_4_ = auVar38._12_4_ * auVar69._12_4_;
  auVar75._16_4_ = auVar69._16_4_ * 0.0;
  auVar75._20_4_ = auVar69._20_4_ * 0.0;
  auVar75._24_4_ = auVar69._24_4_ * 0.0;
  auVar75._28_4_ = auVar69._28_4_;
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 9 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar48));
  auVar68 = vpbroadcastd_avx512vl();
  auVar67 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar3 * 0x10 + 6));
  auVar86._0_4_ = auVar38._0_4_ * auVar69._0_4_;
  auVar86._4_4_ = auVar38._4_4_ * auVar69._4_4_;
  auVar86._8_4_ = auVar38._8_4_ * auVar69._8_4_;
  auVar86._12_4_ = auVar38._12_4_ * auVar69._12_4_;
  auVar86._16_4_ = auVar69._16_4_ * 0.0;
  auVar86._20_4_ = auVar69._20_4_ * 0.0;
  auVar86._24_4_ = auVar69._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar3 * 0x10 + uVar35 * -2 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar47));
  auVar76._4_4_ = auVar50._4_4_ * auVar69._4_4_;
  auVar76._0_4_ = auVar50._0_4_ * auVar69._0_4_;
  auVar76._8_4_ = auVar50._8_4_ * auVar69._8_4_;
  auVar76._12_4_ = auVar50._12_4_ * auVar69._12_4_;
  auVar76._16_4_ = auVar69._16_4_ * 0.0;
  auVar76._20_4_ = auVar69._20_4_ * 0.0;
  auVar76._24_4_ = auVar69._24_4_ * 0.0;
  auVar76._28_4_ = auVar69._28_4_;
  auVar69 = vcvtdq2ps_avx(auVar67);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar47));
  auVar83._0_4_ = auVar50._0_4_ * auVar69._0_4_;
  auVar83._4_4_ = auVar50._4_4_ * auVar69._4_4_;
  auVar83._8_4_ = auVar50._8_4_ * auVar69._8_4_;
  auVar83._12_4_ = auVar50._12_4_ * auVar69._12_4_;
  auVar83._16_4_ = auVar69._16_4_ * 0.0;
  auVar83._20_4_ = auVar69._20_4_ * 0.0;
  auVar83._24_4_ = auVar69._24_4_ * 0.0;
  auVar83._28_4_ = 0;
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 + uVar35 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar46));
  auVar77._4_4_ = auVar69._4_4_ * auVar49._4_4_;
  auVar77._0_4_ = auVar69._0_4_ * auVar49._0_4_;
  auVar77._8_4_ = auVar69._8_4_ * auVar49._8_4_;
  auVar77._12_4_ = auVar69._12_4_ * auVar49._12_4_;
  auVar77._16_4_ = auVar69._16_4_ * 0.0;
  auVar77._20_4_ = auVar69._20_4_ * 0.0;
  auVar77._24_4_ = auVar69._24_4_ * 0.0;
  auVar77._28_4_ = auVar69._28_4_;
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 0x17 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar46));
  auVar82._0_4_ = auVar49._0_4_ * auVar69._0_4_;
  auVar82._4_4_ = auVar49._4_4_ * auVar69._4_4_;
  auVar82._8_4_ = auVar49._8_4_ * auVar69._8_4_;
  auVar82._12_4_ = auVar49._12_4_ * auVar69._12_4_;
  auVar82._16_4_ = auVar69._16_4_ * 0.0;
  auVar82._20_4_ = auVar69._20_4_ * 0.0;
  auVar82._24_4_ = auVar69._24_4_ * 0.0;
  auVar82._28_4_ = 0;
  auVar69 = vpminsd_avx2(auVar75,auVar86);
  auVar67 = vpminsd_avx2(auVar76,auVar83);
  auVar69 = vmaxps_avx(auVar69,auVar67);
  auVar67 = vpminsd_avx2(auVar77,auVar82);
  uVar108 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar74._4_4_ = uVar108;
  auVar74._0_4_ = uVar108;
  auVar74._8_4_ = uVar108;
  auVar74._12_4_ = uVar108;
  auVar74._16_4_ = uVar108;
  auVar74._20_4_ = uVar108;
  auVar74._24_4_ = uVar108;
  auVar74._28_4_ = uVar108;
  auVar67 = vmaxps_avx512vl(auVar67,auVar74);
  auVar69 = vmaxps_avx(auVar69,auVar67);
  auVar67._8_4_ = 0x3f7ffffa;
  auVar67._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar67._12_4_ = 0x3f7ffffa;
  auVar67._16_4_ = 0x3f7ffffa;
  auVar67._20_4_ = 0x3f7ffffa;
  auVar67._24_4_ = 0x3f7ffffa;
  auVar67._28_4_ = 0x3f7ffffa;
  local_b8 = vmulps_avx512vl(auVar69,auVar67);
  auVar69 = vpmaxsd_avx2(auVar75,auVar86);
  auVar67 = vpmaxsd_avx2(auVar76,auVar83);
  auVar69 = vminps_avx(auVar69,auVar67);
  auVar67 = vpmaxsd_avx2(auVar77,auVar82);
  uVar108 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar84._4_4_ = uVar108;
  auVar84._0_4_ = uVar108;
  auVar84._8_4_ = uVar108;
  auVar84._12_4_ = uVar108;
  auVar84._16_4_ = uVar108;
  auVar84._20_4_ = uVar108;
  auVar84._24_4_ = uVar108;
  auVar84._28_4_ = uVar108;
  auVar67 = vminps_avx512vl(auVar67,auVar84);
  auVar69 = vminps_avx(auVar69,auVar67);
  auVar85._8_4_ = 0x3f800003;
  auVar85._0_8_ = 0x3f8000033f800003;
  auVar85._12_4_ = 0x3f800003;
  auVar85._16_4_ = 0x3f800003;
  auVar85._20_4_ = 0x3f800003;
  auVar85._24_4_ = 0x3f800003;
  auVar85._28_4_ = 0x3f800003;
  auVar69 = vmulps_avx512vl(auVar69,auVar85);
  uVar15 = vpcmpgtd_avx512vl(auVar68,_DAT_0205a920);
  uVar14 = vcmpps_avx512vl(local_b8,auVar69,2);
  if ((byte)((byte)uVar14 & (byte)uVar15) == 0) {
    return;
  }
  uVar37 = (ulong)(byte)((byte)uVar14 & (byte)uVar15);
  local_2e8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar50 = auVar69._16_16_;
  auVar38 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar257 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar248 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar249 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar250 = ZEXT1664(auVar38);
  auVar38 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar256 = ZEXT1664(auVar38);
LAB_01d620f4:
  lVar34 = 0;
  for (uVar30 = uVar37; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
    lVar34 = lVar34 + 1;
  }
  uVar36 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar34 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar36].ptr;
  uVar30 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar38 = *(undefined1 (*) [16])(_Var9 + uVar30 * (long)pvVar8);
  auVar49 = *(undefined1 (*) [16])(_Var9 + (uVar30 + 1) * (long)pvVar8);
  auVar48 = *(undefined1 (*) [16])(_Var9 + (uVar30 + 2) * (long)pvVar8);
  auVar47 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar30 + 3));
  lVar34 = *(long *)&pGVar6[1].time_range.upper;
  auVar46 = *(undefined1 (*) [16])(lVar34 + (long)p_Var7 * uVar30);
  auVar45 = *(undefined1 (*) [16])(lVar34 + (long)p_Var7 * (uVar30 + 1));
  auVar44 = *(undefined1 (*) [16])(lVar34 + (long)p_Var7 * (uVar30 + 2));
  uVar37 = uVar37 - 1 & uVar37;
  auVar43 = *(undefined1 (*) [16])(lVar34 + (long)p_Var7 * (uVar30 + 3));
  if (uVar37 != 0) {
    uVar35 = uVar37 - 1 & uVar37;
    for (uVar30 = uVar37; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
    }
    if (uVar35 != 0) {
      for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar103 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar103 = vinsertps_avx(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar128 = *(float *)(ray + k * 4 + 0x30);
  auVar118 = auVar257._0_16_;
  auVar39 = vmulps_avx512vl(auVar43,auVar118);
  auVar238._8_4_ = 0x3e2aaaab;
  auVar238._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar238._12_4_ = 0x3e2aaaab;
  auVar40 = vfmadd213ps_fma(auVar238,auVar44,auVar39);
  auVar244._8_4_ = 0x3f2aaaab;
  auVar244._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar244._12_4_ = 0x3f2aaaab;
  auVar40 = vfmadd231ps_fma(auVar40,auVar45,auVar244);
  auVar109 = vfmadd231ps_fma(auVar40,auVar46,auVar238);
  auVar51 = auVar248._0_16_;
  auVar40 = vfmadd231ps_avx512vl(auVar39,auVar44,auVar51);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar45,auVar118);
  auVar41 = vfnmadd231ps_avx512vl(auVar40,auVar46,auVar51);
  auVar39 = vmulps_avx512vl(auVar47,auVar118);
  auVar40 = vfmadd213ps_fma(auVar238,auVar48,auVar39);
  auVar40 = vfmadd231ps_fma(auVar40,auVar49,auVar244);
  auVar40 = vfmadd231ps_fma(auVar40,auVar38,auVar238);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar48,auVar51);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar49,auVar118);
  auVar42 = vfnmadd231ps_avx512vl(auVar39,auVar38,auVar51);
  auVar54._0_4_ = auVar43._0_4_ * 0.16666667;
  auVar54._4_4_ = auVar43._4_4_ * 0.16666667;
  auVar54._8_4_ = auVar43._8_4_ * 0.16666667;
  auVar54._12_4_ = auVar43._12_4_ * 0.16666667;
  auVar39 = vfmadd231ps_fma(auVar54,auVar44,auVar244);
  auVar39 = vfmadd231ps_fma(auVar39,auVar45,auVar238);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar46,auVar118);
  auVar43 = vmulps_avx512vl(auVar43,auVar51);
  auVar44 = vfmadd231ps_avx512vl(auVar43,auVar118,auVar44);
  auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar51,auVar45);
  auVar44 = vfnmadd231ps_avx512vl(auVar45,auVar118,auVar46);
  auVar187._0_4_ = auVar47._0_4_ * 0.16666667;
  auVar187._4_4_ = auVar47._4_4_ * 0.16666667;
  auVar187._8_4_ = auVar47._8_4_ * 0.16666667;
  auVar187._12_4_ = auVar47._12_4_ * 0.16666667;
  auVar46 = vfmadd231ps_fma(auVar187,auVar48,auVar244);
  auVar46 = vfmadd231ps_fma(auVar46,auVar49,auVar238);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar38,auVar118);
  auVar47 = vmulps_avx512vl(auVar47,auVar51);
  auVar48 = vfmadd231ps_avx512vl(auVar47,auVar118,auVar48);
  auVar49 = vfnmadd231ps_avx512vl(auVar48,auVar51,auVar49);
  auVar45 = vfnmadd231ps_avx512vl(auVar49,auVar118,auVar38);
  auVar38 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar49 = vshufps_avx(auVar40,auVar40,0xc9);
  fVar105 = auVar41._0_4_;
  auVar58._0_4_ = fVar105 * auVar49._0_4_;
  fVar106 = auVar41._4_4_;
  auVar58._4_4_ = fVar106 * auVar49._4_4_;
  fVar107 = auVar41._8_4_;
  auVar58._8_4_ = fVar107 * auVar49._8_4_;
  fVar127 = auVar41._12_4_;
  auVar58._12_4_ = fVar127 * auVar49._12_4_;
  auVar49 = vfmsub231ps_fma(auVar58,auVar38,auVar40);
  auVar48 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar49 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar55._0_4_ = fVar105 * auVar49._0_4_;
  auVar55._4_4_ = fVar106 * auVar49._4_4_;
  auVar55._8_4_ = fVar107 * auVar49._8_4_;
  auVar55._12_4_ = fVar127 * auVar49._12_4_;
  auVar38 = vfmsub231ps_fma(auVar55,auVar38,auVar42);
  auVar47 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar49 = vshufps_avx(auVar46,auVar46,0xc9);
  fVar137 = auVar44._0_4_;
  auVar60._0_4_ = fVar137 * auVar49._0_4_;
  fVar145 = auVar44._4_4_;
  auVar60._4_4_ = fVar145 * auVar49._4_4_;
  fVar146 = auVar44._8_4_;
  auVar60._8_4_ = fVar146 * auVar49._8_4_;
  fVar147 = auVar44._12_4_;
  auVar60._12_4_ = fVar147 * auVar49._12_4_;
  auVar49 = vfmsub231ps_fma(auVar60,auVar38,auVar46);
  auVar46 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar49 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar188._0_4_ = auVar49._0_4_ * fVar137;
  auVar188._4_4_ = auVar49._4_4_ * fVar145;
  auVar188._8_4_ = auVar49._8_4_ * fVar146;
  auVar188._12_4_ = auVar49._12_4_ * fVar147;
  auVar49 = vfmsub231ps_fma(auVar188,auVar38,auVar45);
  auVar38 = vdpps_avx(auVar48,auVar48,0x7f);
  auVar45 = vshufps_avx(auVar49,auVar49,0xc9);
  fVar195 = auVar38._0_4_;
  auVar71._16_16_ = auVar50;
  auVar71._0_16_ = auVar118;
  auVar70._4_28_ = auVar71._4_28_;
  auVar70._0_4_ = fVar195;
  auVar49 = vrsqrt14ss_avx512f(auVar118,auVar70._0_16_);
  fVar102 = auVar49._0_4_;
  auVar43 = vmulss_avx512f(auVar38,ZEXT416(0xbf000000));
  auVar49 = vdpps_avx(auVar48,auVar47,0x7f);
  fVar102 = fVar102 * 1.5 + auVar43._0_4_ * fVar102 * fVar102 * fVar102;
  fVar216 = fVar102 * auVar48._0_4_;
  fVar224 = fVar102 * auVar48._4_4_;
  fVar225 = fVar102 * auVar48._8_4_;
  fVar226 = fVar102 * auVar48._12_4_;
  auVar196._0_4_ = auVar47._0_4_ * fVar195;
  auVar196._4_4_ = auVar47._4_4_ * fVar195;
  auVar196._8_4_ = auVar47._8_4_ * fVar195;
  auVar196._12_4_ = auVar47._12_4_ * fVar195;
  fVar195 = auVar49._0_4_;
  auVar62._0_4_ = fVar195 * auVar48._0_4_;
  auVar62._4_4_ = fVar195 * auVar48._4_4_;
  auVar62._8_4_ = fVar195 * auVar48._8_4_;
  auVar62._12_4_ = fVar195 * auVar48._12_4_;
  auVar49 = vsubps_avx(auVar196,auVar62);
  auVar48 = vrcp14ss_avx512f(auVar118,auVar70._0_16_);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar48,ZEXT416(0x40000000));
  fVar208 = auVar48._0_4_ * auVar38._0_4_;
  auVar38 = vdpps_avx(auVar46,auVar46,0x7f);
  fVar209 = auVar38._0_4_;
  auVar73._16_16_ = auVar50;
  auVar73._0_16_ = auVar118;
  auVar72._4_28_ = auVar73._4_28_;
  auVar72._0_4_ = fVar209;
  auVar50 = vrsqrt14ss_avx512f(auVar118,auVar72._0_16_);
  fVar195 = auVar50._0_4_;
  auVar50 = vmulss_avx512f(auVar38,ZEXT416(0xbf000000));
  fVar195 = fVar195 * 1.5 + auVar50._0_4_ * fVar195 * fVar195 * fVar195;
  auVar50 = vdpps_avx(auVar46,auVar45,0x7f);
  fVar227 = fVar195 * auVar46._0_4_;
  fVar235 = fVar195 * auVar46._4_4_;
  fVar236 = fVar195 * auVar46._8_4_;
  fVar237 = fVar195 * auVar46._12_4_;
  auVar56._0_4_ = fVar209 * auVar45._0_4_;
  auVar56._4_4_ = fVar209 * auVar45._4_4_;
  auVar56._8_4_ = fVar209 * auVar45._8_4_;
  auVar56._12_4_ = fVar209 * auVar45._12_4_;
  fVar209 = auVar50._0_4_;
  auVar61._0_4_ = fVar209 * auVar46._0_4_;
  auVar61._4_4_ = fVar209 * auVar46._4_4_;
  auVar61._8_4_ = fVar209 * auVar46._8_4_;
  auVar61._12_4_ = fVar209 * auVar46._12_4_;
  auVar48 = vsubps_avx(auVar56,auVar61);
  auVar50 = vrcp14ss_avx512f(auVar118,auVar72._0_16_);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar50,ZEXT416(0x40000000));
  fVar209 = auVar38._0_4_ * auVar50._0_4_;
  auVar38 = vshufps_avx(auVar109,auVar109,0xff);
  auVar174._0_4_ = fVar216 * auVar38._0_4_;
  auVar174._4_4_ = fVar224 * auVar38._4_4_;
  auVar174._8_4_ = fVar225 * auVar38._8_4_;
  auVar174._12_4_ = fVar226 * auVar38._12_4_;
  local_208 = vsubps_avx(auVar109,auVar174);
  auVar50 = vshufps_avx(auVar41,auVar41,0xff);
  auVar57._0_4_ = auVar50._0_4_ * fVar216 + auVar38._0_4_ * fVar102 * fVar208 * auVar49._0_4_;
  auVar57._4_4_ = auVar50._4_4_ * fVar224 + auVar38._4_4_ * fVar102 * fVar208 * auVar49._4_4_;
  auVar57._8_4_ = auVar50._8_4_ * fVar225 + auVar38._8_4_ * fVar102 * fVar208 * auVar49._8_4_;
  auVar57._12_4_ = auVar50._12_4_ * fVar226 + auVar38._12_4_ * fVar102 * fVar208 * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar41,auVar57);
  local_218._0_4_ = auVar174._0_4_ + auVar109._0_4_;
  local_218._4_4_ = auVar174._4_4_ + auVar109._4_4_;
  fStack_210 = auVar174._8_4_ + auVar109._8_4_;
  fStack_20c = auVar174._12_4_ + auVar109._12_4_;
  auVar38 = vshufps_avx(auVar39,auVar39,0xff);
  auVar154._0_4_ = fVar227 * auVar38._0_4_;
  auVar154._4_4_ = fVar235 * auVar38._4_4_;
  auVar154._8_4_ = fVar236 * auVar38._8_4_;
  auVar154._12_4_ = fVar237 * auVar38._12_4_;
  local_228 = vsubps_avx512vl(auVar39,auVar154);
  auVar50 = vshufps_avx(auVar44,auVar44,0xff);
  auVar41._0_4_ = auVar50._0_4_ * fVar227 + auVar38._0_4_ * fVar195 * auVar48._0_4_ * fVar209;
  auVar41._4_4_ = auVar50._4_4_ * fVar235 + auVar38._4_4_ * fVar195 * auVar48._4_4_ * fVar209;
  auVar41._8_4_ = auVar50._8_4_ * fVar236 + auVar38._8_4_ * fVar195 * auVar48._8_4_ * fVar209;
  auVar41._12_4_ = auVar50._12_4_ * fVar237 + auVar38._12_4_ * fVar195 * auVar48._12_4_ * fVar209;
  auVar38 = vsubps_avx(auVar44,auVar41);
  local_238._0_4_ = auVar39._0_4_ + auVar154._0_4_;
  local_238._4_4_ = auVar39._4_4_ + auVar154._4_4_;
  fStack_230 = auVar39._8_4_ + auVar154._8_4_;
  fStack_22c = auVar39._12_4_ + auVar154._12_4_;
  auVar52._0_4_ = auVar49._0_4_ * 0.33333334;
  auVar52._4_4_ = auVar49._4_4_ * 0.33333334;
  auVar52._8_4_ = auVar49._8_4_ * 0.33333334;
  auVar52._12_4_ = auVar49._12_4_ * 0.33333334;
  local_248 = vaddps_avx512vl(local_208,auVar52);
  auVar63._0_4_ = auVar38._0_4_ * 0.33333334;
  auVar63._4_4_ = auVar38._4_4_ * 0.33333334;
  auVar63._8_4_ = auVar38._8_4_ * 0.33333334;
  auVar63._12_4_ = auVar38._12_4_ * 0.33333334;
  local_258 = vsubps_avx512vl(local_228,auVar63);
  auVar40._0_4_ = (fVar105 + auVar57._0_4_) * 0.33333334;
  auVar40._4_4_ = (fVar106 + auVar57._4_4_) * 0.33333334;
  auVar40._8_4_ = (fVar107 + auVar57._8_4_) * 0.33333334;
  auVar40._12_4_ = (fVar127 + auVar57._12_4_) * 0.33333334;
  _local_268 = vaddps_avx512vl(_local_218,auVar40);
  auVar109._0_4_ = (fVar137 + auVar41._0_4_) * 0.33333334;
  auVar109._4_4_ = (fVar145 + auVar41._4_4_) * 0.33333334;
  auVar109._8_4_ = (fVar146 + auVar41._8_4_) * 0.33333334;
  auVar109._12_4_ = (fVar147 + auVar41._12_4_) * 0.33333334;
  _local_278 = vsubps_avx512vl(_local_238,auVar109);
  local_188 = vsubps_avx(local_208,auVar103);
  uVar108 = local_188._0_4_;
  auVar51._4_4_ = uVar108;
  auVar51._0_4_ = uVar108;
  auVar51._8_4_ = uVar108;
  auVar51._12_4_ = uVar108;
  auVar38 = vshufps_avx(local_188,local_188,0x55);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  auVar50 = vshufps_avx(local_188,local_188,0xaa);
  fVar102 = pre->ray_space[k].vz.field_0.m128[0];
  fVar195 = pre->ray_space[k].vz.field_0.m128[1];
  fVar208 = pre->ray_space[k].vz.field_0.m128[2];
  fVar209 = pre->ray_space[k].vz.field_0.m128[3];
  auVar39._0_4_ = fVar102 * auVar50._0_4_;
  auVar39._4_4_ = fVar195 * auVar50._4_4_;
  auVar39._8_4_ = fVar208 * auVar50._8_4_;
  auVar39._12_4_ = fVar209 * auVar50._12_4_;
  auVar38 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar38);
  auVar45 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar51);
  local_198 = vsubps_avx512vl(local_248,auVar103);
  uVar108 = local_198._0_4_;
  auVar53._4_4_ = uVar108;
  auVar53._0_4_ = uVar108;
  auVar53._8_4_ = uVar108;
  auVar53._12_4_ = uVar108;
  auVar38 = vshufps_avx(local_198,local_198,0x55);
  auVar50 = vshufps_avx(local_198,local_198,0xaa);
  auVar118._0_4_ = fVar102 * auVar50._0_4_;
  auVar118._4_4_ = fVar195 * auVar50._4_4_;
  auVar118._8_4_ = fVar208 * auVar50._8_4_;
  auVar118._12_4_ = fVar209 * auVar50._12_4_;
  auVar38 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar2,auVar38);
  auVar44 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar53);
  local_1a8 = vsubps_avx512vl(local_258,auVar103);
  uVar108 = local_1a8._0_4_;
  auVar155._4_4_ = uVar108;
  auVar155._0_4_ = uVar108;
  auVar155._8_4_ = uVar108;
  auVar155._12_4_ = uVar108;
  auVar38 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar50 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar59._0_4_ = fVar102 * auVar50._0_4_;
  auVar59._4_4_ = fVar195 * auVar50._4_4_;
  auVar59._8_4_ = fVar208 * auVar50._8_4_;
  auVar59._12_4_ = fVar209 * auVar50._12_4_;
  auVar38 = vfmadd231ps_fma(auVar59,(undefined1  [16])aVar2,auVar38);
  auVar43 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar155);
  local_1b8 = vsubps_avx512vl(local_228,auVar103);
  uVar108 = local_1b8._0_4_;
  auVar175._4_4_ = uVar108;
  auVar175._0_4_ = uVar108;
  auVar175._8_4_ = uVar108;
  auVar175._12_4_ = uVar108;
  auVar38 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar50 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar156._0_4_ = fVar102 * auVar50._0_4_;
  auVar156._4_4_ = fVar195 * auVar50._4_4_;
  auVar156._8_4_ = fVar208 * auVar50._8_4_;
  auVar156._12_4_ = fVar209 * auVar50._12_4_;
  auVar38 = vfmadd231ps_fma(auVar156,(undefined1  [16])aVar2,auVar38);
  auVar40 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar175);
  local_1c8 = vsubps_avx(_local_218,auVar103);
  uVar108 = local_1c8._0_4_;
  auVar176._4_4_ = uVar108;
  auVar176._0_4_ = uVar108;
  auVar176._8_4_ = uVar108;
  auVar176._12_4_ = uVar108;
  auVar38 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar50 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar197._0_4_ = auVar50._0_4_ * fVar102;
  auVar197._4_4_ = auVar50._4_4_ * fVar195;
  auVar197._8_4_ = auVar50._8_4_ * fVar208;
  auVar197._12_4_ = auVar50._12_4_ * fVar209;
  auVar38 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar2,auVar38);
  auVar109 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar176);
  local_1d8 = vsubps_avx512vl(_local_268,auVar103);
  uVar108 = local_1d8._0_4_;
  auVar177._4_4_ = uVar108;
  auVar177._0_4_ = uVar108;
  auVar177._8_4_ = uVar108;
  auVar177._12_4_ = uVar108;
  auVar38 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar50 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar210._0_4_ = auVar50._0_4_ * fVar102;
  auVar210._4_4_ = auVar50._4_4_ * fVar195;
  auVar210._8_4_ = auVar50._8_4_ * fVar208;
  auVar210._12_4_ = auVar50._12_4_ * fVar209;
  auVar38 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar2,auVar38);
  auVar39 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar177);
  local_1e8 = vsubps_avx512vl(_local_278,auVar103);
  uVar108 = local_1e8._0_4_;
  auVar178._4_4_ = uVar108;
  auVar178._0_4_ = uVar108;
  auVar178._8_4_ = uVar108;
  auVar178._12_4_ = uVar108;
  auVar38 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar50 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar217._0_4_ = auVar50._0_4_ * fVar102;
  auVar217._4_4_ = auVar50._4_4_ * fVar195;
  auVar217._8_4_ = auVar50._8_4_ * fVar208;
  auVar217._12_4_ = auVar50._12_4_ * fVar209;
  auVar38 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar2,auVar38);
  auVar41 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar178);
  local_1f8 = vsubps_avx(_local_238,auVar103);
  uVar108 = local_1f8._0_4_;
  auVar103._4_4_ = uVar108;
  auVar103._0_4_ = uVar108;
  auVar103._8_4_ = uVar108;
  auVar103._12_4_ = uVar108;
  auVar38 = vshufps_avx(local_1f8,local_1f8,0x55);
  auVar50 = vshufps_avx(local_1f8,local_1f8,0xaa);
  auVar163._0_4_ = auVar50._0_4_ * fVar102;
  auVar163._4_4_ = auVar50._4_4_ * fVar195;
  auVar163._8_4_ = auVar50._8_4_ * fVar208;
  auVar163._12_4_ = auVar50._12_4_ * fVar209;
  auVar38 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar2,auVar38);
  auVar103 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar103);
  auVar49 = vmovlhps_avx(auVar45,auVar109);
  auVar48 = vmovlhps_avx(auVar44,auVar39);
  auVar46 = vmovlhps_avx512f(auVar43,auVar41);
  _local_328 = vmovlhps_avx512f(auVar40,auVar103);
  auVar50 = vminps_avx(auVar49,auVar48);
  auVar38 = vmaxps_avx(auVar49,auVar48);
  auVar47 = vminps_avx512vl(auVar46,_local_328);
  auVar50 = vminps_avx(auVar50,auVar47);
  auVar47 = vmaxps_avx512vl(auVar46,_local_328);
  auVar38 = vmaxps_avx(auVar38,auVar47);
  auVar47 = vshufpd_avx(auVar50,auVar50,3);
  auVar50 = vminps_avx(auVar50,auVar47);
  auVar47 = vshufpd_avx(auVar38,auVar38,3);
  auVar38 = vmaxps_avx(auVar38,auVar47);
  auVar50 = vandps_avx512vl(auVar50,auVar249._0_16_);
  auVar38 = vandps_avx512vl(auVar38,auVar249._0_16_);
  auVar38 = vmaxps_avx(auVar50,auVar38);
  auVar50 = vmovshdup_avx(auVar38);
  auVar38 = vmaxss_avx(auVar50,auVar38);
  local_308 = vmovddup_avx512vl(auVar45);
  local_318 = vmovddup_avx512vl(auVar44);
  auVar42._8_8_ = auVar43._0_8_;
  auVar42._0_8_ = auVar43._0_8_;
  auVar157._0_8_ = auVar40._0_8_;
  auVar157._8_8_ = auVar157._0_8_;
  local_338 = ZEXT416((uint)(auVar38._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_338);
  auVar38 = vxorps_avx512vl(local_78._0_16_,auVar250._0_16_);
  local_98 = vbroadcastss_avx512vl(auVar38);
  uVar30 = 0;
  auVar38 = vsubps_avx(auVar48,auVar49);
  auVar47 = vsubps_avx512vl(auVar46,auVar48);
  local_178 = vsubps_avx512vl(_local_328,auVar46);
  local_288 = vsubps_avx(_local_218,local_208);
  local_298 = vsubps_avx512vl(_local_268,local_248);
  local_2a8 = vsubps_avx512vl(_local_278,local_258);
  _local_2b8 = vsubps_avx512vl(_local_238,local_228);
  local_2c8 = vpbroadcastd_avx512vl();
  local_2d8 = vpbroadcastd_avx512vl();
  auVar50 = ZEXT816(0x3f80000000000000);
  auVar247 = ZEXT1664(auVar50);
  do {
    auVar52 = auVar247._0_16_;
    auVar45 = vshufps_avx(auVar52,auVar52,0x50);
    auVar228._8_4_ = 0x3f800000;
    auVar228._0_8_ = &DAT_3f8000003f800000;
    auVar228._12_4_ = 0x3f800000;
    auVar234._16_4_ = 0x3f800000;
    auVar234._0_16_ = auVar228;
    auVar234._20_4_ = 0x3f800000;
    auVar234._24_4_ = 0x3f800000;
    auVar234._28_4_ = 0x3f800000;
    auVar44 = vsubps_avx(auVar228,auVar45);
    fVar102 = auVar45._0_4_;
    fVar105 = auVar109._0_4_;
    auVar129._0_4_ = fVar105 * fVar102;
    fVar195 = auVar45._4_4_;
    fVar106 = auVar109._4_4_;
    auVar129._4_4_ = fVar106 * fVar195;
    fVar208 = auVar45._8_4_;
    auVar129._8_4_ = fVar105 * fVar208;
    fVar209 = auVar45._12_4_;
    auVar129._12_4_ = fVar106 * fVar209;
    fVar107 = auVar39._0_4_;
    auVar138._0_4_ = fVar107 * fVar102;
    fVar127 = auVar39._4_4_;
    auVar138._4_4_ = fVar127 * fVar195;
    auVar138._8_4_ = fVar107 * fVar208;
    auVar138._12_4_ = fVar127 * fVar209;
    fVar137 = auVar41._0_4_;
    auVar148._0_4_ = fVar137 * fVar102;
    fVar145 = auVar41._4_4_;
    auVar148._4_4_ = fVar145 * fVar195;
    auVar148._8_4_ = fVar137 * fVar208;
    auVar148._12_4_ = fVar145 * fVar209;
    fVar146 = auVar103._0_4_;
    auVar110._0_4_ = fVar146 * fVar102;
    fVar147 = auVar103._4_4_;
    auVar110._4_4_ = fVar147 * fVar195;
    auVar110._8_4_ = fVar146 * fVar208;
    auVar110._12_4_ = fVar147 * fVar209;
    auVar43 = vfmadd231ps_avx512vl(auVar129,auVar44,local_308);
    auVar40 = vfmadd231ps_avx512vl(auVar138,auVar44,local_318);
    auVar51 = vfmadd231ps_avx512vl(auVar148,auVar44,auVar42);
    auVar44 = vfmadd231ps_fma(auVar110,auVar157,auVar44);
    auVar45 = vmovshdup_avx(auVar50);
    fVar195 = auVar50._0_4_;
    fVar102 = (auVar45._0_4_ - fVar195) * 0.04761905;
    auVar173._4_4_ = fVar195;
    auVar173._0_4_ = fVar195;
    auVar173._8_4_ = fVar195;
    auVar173._12_4_ = fVar195;
    auVar173._16_4_ = fVar195;
    auVar173._20_4_ = fVar195;
    auVar173._24_4_ = fVar195;
    auVar173._28_4_ = fVar195;
    auVar124._0_8_ = auVar45._0_8_;
    auVar124._8_8_ = auVar124._0_8_;
    auVar124._16_8_ = auVar124._0_8_;
    auVar124._24_8_ = auVar124._0_8_;
    auVar69 = vsubps_avx(auVar124,auVar173);
    uVar108 = auVar43._0_4_;
    auVar125._4_4_ = uVar108;
    auVar125._0_4_ = uVar108;
    auVar125._8_4_ = uVar108;
    auVar125._12_4_ = uVar108;
    auVar125._16_4_ = uVar108;
    auVar125._20_4_ = uVar108;
    auVar125._24_4_ = uVar108;
    auVar125._28_4_ = uVar108;
    auVar192._8_4_ = 1;
    auVar192._0_8_ = 0x100000001;
    auVar192._12_4_ = 1;
    auVar192._16_4_ = 1;
    auVar192._20_4_ = 1;
    auVar192._24_4_ = 1;
    auVar192._28_4_ = 1;
    auVar84 = ZEXT1632(auVar43);
    auVar67 = vpermps_avx2(auVar192,auVar84);
    auVar74 = vbroadcastss_avx512vl(auVar40);
    auVar85 = ZEXT1632(auVar40);
    auVar68 = vpermps_avx512vl(auVar192,auVar85);
    auVar75 = vbroadcastss_avx512vl(auVar51);
    auVar65 = ZEXT1632(auVar51);
    auVar76 = vpermps_avx512vl(auVar192,auVar65);
    auVar77 = vbroadcastss_avx512vl(auVar44);
    auVar81 = ZEXT1632(auVar44);
    auVar78 = vpermps_avx512vl(auVar192,auVar81);
    auVar193._4_4_ = fVar102;
    auVar193._0_4_ = fVar102;
    auVar193._8_4_ = fVar102;
    auVar193._12_4_ = fVar102;
    auVar193._16_4_ = fVar102;
    auVar193._20_4_ = fVar102;
    auVar193._24_4_ = fVar102;
    auVar193._28_4_ = fVar102;
    auVar82 = auVar254._0_32_;
    auVar66 = vpermps_avx512vl(auVar82,auVar84);
    auVar161._8_4_ = 3;
    auVar161._0_8_ = 0x300000003;
    auVar161._12_4_ = 3;
    auVar161._16_4_ = 3;
    auVar161._20_4_ = 3;
    auVar161._24_4_ = 3;
    auVar161._28_4_ = 3;
    auVar79 = vpermps_avx512vl(auVar161,auVar84);
    auVar80 = vpermps_avx512vl(auVar82,auVar85);
    auVar84 = vpermps_avx2(auVar161,auVar85);
    auVar64 = vpermps_avx512vl(auVar82,auVar65);
    auVar85 = vpermps_avx2(auVar161,auVar65);
    auVar65 = vpermps_avx512vl(auVar82,auVar81);
    auVar81 = vpermps_avx512vl(auVar161,auVar81);
    auVar45 = vfmadd132ps_fma(auVar69,auVar173,_DAT_02020f20);
    auVar69 = vsubps_avx(auVar234,ZEXT1632(auVar45));
    auVar82 = vmulps_avx512vl(auVar74,ZEXT1632(auVar45));
    auVar86 = ZEXT1632(auVar45);
    auVar83 = vmulps_avx512vl(auVar68,auVar86);
    auVar44 = vfmadd231ps_fma(auVar82,auVar69,auVar125);
    auVar43 = vfmadd231ps_fma(auVar83,auVar69,auVar67);
    auVar82 = vmulps_avx512vl(auVar75,auVar86);
    auVar83 = vmulps_avx512vl(auVar76,auVar86);
    auVar74 = vfmadd231ps_avx512vl(auVar82,auVar69,auVar74);
    auVar68 = vfmadd231ps_avx512vl(auVar83,auVar69,auVar68);
    auVar82 = vmulps_avx512vl(auVar77,auVar86);
    auVar83 = ZEXT1632(auVar45);
    auVar78 = vmulps_avx512vl(auVar78,auVar83);
    auVar75 = vfmadd231ps_avx512vl(auVar82,auVar69,auVar75);
    auVar76 = vfmadd231ps_avx512vl(auVar78,auVar69,auVar76);
    fVar208 = auVar45._0_4_;
    fVar209 = auVar45._4_4_;
    auVar18._4_4_ = fVar209 * auVar74._4_4_;
    auVar18._0_4_ = fVar208 * auVar74._0_4_;
    fVar216 = auVar45._8_4_;
    auVar18._8_4_ = fVar216 * auVar74._8_4_;
    fVar224 = auVar45._12_4_;
    auVar18._12_4_ = fVar224 * auVar74._12_4_;
    auVar18._16_4_ = auVar74._16_4_ * 0.0;
    auVar18._20_4_ = auVar74._20_4_ * 0.0;
    auVar18._24_4_ = auVar74._24_4_ * 0.0;
    auVar18._28_4_ = fVar195;
    auVar19._4_4_ = fVar209 * auVar68._4_4_;
    auVar19._0_4_ = fVar208 * auVar68._0_4_;
    auVar19._8_4_ = fVar216 * auVar68._8_4_;
    auVar19._12_4_ = fVar224 * auVar68._12_4_;
    auVar19._16_4_ = auVar68._16_4_ * 0.0;
    auVar19._20_4_ = auVar68._20_4_ * 0.0;
    auVar19._24_4_ = auVar68._24_4_ * 0.0;
    auVar19._28_4_ = auVar67._28_4_;
    auVar44 = vfmadd231ps_fma(auVar18,auVar69,ZEXT1632(auVar44));
    auVar43 = vfmadd231ps_fma(auVar19,auVar69,ZEXT1632(auVar43));
    auVar116._0_4_ = fVar208 * auVar75._0_4_;
    auVar116._4_4_ = fVar209 * auVar75._4_4_;
    auVar116._8_4_ = fVar216 * auVar75._8_4_;
    auVar116._12_4_ = fVar224 * auVar75._12_4_;
    auVar116._16_4_ = auVar75._16_4_ * 0.0;
    auVar116._20_4_ = auVar75._20_4_ * 0.0;
    auVar116._24_4_ = auVar75._24_4_ * 0.0;
    auVar116._28_4_ = 0;
    auVar20._4_4_ = fVar209 * auVar76._4_4_;
    auVar20._0_4_ = fVar208 * auVar76._0_4_;
    auVar20._8_4_ = fVar216 * auVar76._8_4_;
    auVar20._12_4_ = fVar224 * auVar76._12_4_;
    auVar20._16_4_ = auVar76._16_4_ * 0.0;
    auVar20._20_4_ = auVar76._20_4_ * 0.0;
    auVar20._24_4_ = auVar76._24_4_ * 0.0;
    auVar20._28_4_ = auVar75._28_4_;
    auVar40 = vfmadd231ps_fma(auVar116,auVar69,auVar74);
    auVar51 = vfmadd231ps_fma(auVar20,auVar69,auVar68);
    auVar21._28_4_ = auVar68._28_4_;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(fVar224 * auVar51._12_4_,
                            CONCAT48(fVar216 * auVar51._8_4_,
                                     CONCAT44(fVar209 * auVar51._4_4_,fVar208 * auVar51._0_4_))));
    auVar118 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar224 * auVar40._12_4_,
                                                  CONCAT48(fVar216 * auVar40._8_4_,
                                                           CONCAT44(fVar209 * auVar40._4_4_,
                                                                    fVar208 * auVar40._0_4_)))),
                               auVar69,ZEXT1632(auVar44));
    auVar54 = vfmadd231ps_fma(auVar21,auVar69,ZEXT1632(auVar43));
    auVar67 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar44));
    auVar74 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar43));
    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar67 = vmulps_avx512vl(auVar67,auVar68);
    auVar74 = vmulps_avx512vl(auVar74,auVar68);
    auVar186._0_4_ = fVar102 * auVar67._0_4_;
    auVar186._4_4_ = fVar102 * auVar67._4_4_;
    auVar186._8_4_ = fVar102 * auVar67._8_4_;
    auVar186._12_4_ = fVar102 * auVar67._12_4_;
    auVar186._16_4_ = fVar102 * auVar67._16_4_;
    auVar186._20_4_ = fVar102 * auVar67._20_4_;
    auVar186._24_4_ = fVar102 * auVar67._24_4_;
    auVar186._28_4_ = 0;
    auVar67 = vmulps_avx512vl(auVar193,auVar74);
    auVar40 = vxorps_avx512vl(auVar77._0_16_,auVar77._0_16_);
    auVar74 = vpermt2ps_avx512vl(ZEXT1632(auVar118),_DAT_0205fd20,ZEXT1632(auVar40));
    auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar54),_DAT_0205fd20,ZEXT1632(auVar40));
    auVar117._0_4_ = auVar186._0_4_ + auVar118._0_4_;
    auVar117._4_4_ = auVar186._4_4_ + auVar118._4_4_;
    auVar117._8_4_ = auVar186._8_4_ + auVar118._8_4_;
    auVar117._12_4_ = auVar186._12_4_ + auVar118._12_4_;
    auVar117._16_4_ = auVar186._16_4_ + 0.0;
    auVar117._20_4_ = auVar186._20_4_ + 0.0;
    auVar117._24_4_ = auVar186._24_4_ + 0.0;
    auVar117._28_4_ = 0;
    auVar86 = ZEXT1632(auVar40);
    auVar76 = vpermt2ps_avx512vl(auVar186,_DAT_0205fd20,auVar86);
    auVar77 = vaddps_avx512vl(ZEXT1632(auVar54),auVar67);
    auVar78 = vpermt2ps_avx512vl(auVar67,_DAT_0205fd20,auVar86);
    auVar67 = vsubps_avx(auVar74,auVar76);
    auVar76 = vsubps_avx512vl(auVar75,auVar78);
    auVar78 = vmulps_avx512vl(auVar80,auVar83);
    auVar82 = vmulps_avx512vl(auVar84,auVar83);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar69,auVar66);
    auVar66 = vfmadd231ps_avx512vl(auVar82,auVar69,auVar79);
    auVar79 = vmulps_avx512vl(auVar64,auVar83);
    auVar82 = vmulps_avx512vl(auVar85,auVar83);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar69,auVar80);
    auVar84 = vfmadd231ps_avx512vl(auVar82,auVar69,auVar84);
    auVar80 = vmulps_avx512vl(auVar65,auVar83);
    auVar65 = vmulps_avx512vl(auVar81,auVar83);
    auVar44 = vfmadd231ps_fma(auVar80,auVar69,auVar64);
    auVar43 = vfmadd231ps_fma(auVar65,auVar69,auVar85);
    auVar80 = vmulps_avx512vl(auVar83,auVar79);
    auVar65 = vmulps_avx512vl(ZEXT1632(auVar45),auVar84);
    auVar78 = vfmadd231ps_avx512vl(auVar80,auVar69,auVar78);
    auVar66 = vfmadd231ps_avx512vl(auVar65,auVar69,auVar66);
    auVar79 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar224 * auVar44._12_4_,
                                            CONCAT48(fVar216 * auVar44._8_4_,
                                                     CONCAT44(fVar209 * auVar44._4_4_,
                                                              fVar208 * auVar44._0_4_)))),auVar69,
                         auVar79);
    auVar84 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar224 * auVar43._12_4_,
                                            CONCAT48(fVar216 * auVar43._8_4_,
                                                     CONCAT44(fVar209 * auVar43._4_4_,
                                                              fVar208 * auVar43._0_4_)))),auVar69,
                         auVar84);
    auVar22._4_4_ = fVar209 * auVar79._4_4_;
    auVar22._0_4_ = fVar208 * auVar79._0_4_;
    auVar22._8_4_ = fVar216 * auVar79._8_4_;
    auVar22._12_4_ = fVar224 * auVar79._12_4_;
    auVar22._16_4_ = auVar79._16_4_ * 0.0;
    auVar22._20_4_ = auVar79._20_4_ * 0.0;
    auVar22._24_4_ = auVar79._24_4_ * 0.0;
    auVar22._28_4_ = auVar85._28_4_;
    auVar23._4_4_ = fVar209 * auVar84._4_4_;
    auVar23._0_4_ = fVar208 * auVar84._0_4_;
    auVar23._8_4_ = fVar216 * auVar84._8_4_;
    auVar23._12_4_ = fVar224 * auVar84._12_4_;
    auVar23._16_4_ = auVar84._16_4_ * 0.0;
    auVar23._20_4_ = auVar84._20_4_ * 0.0;
    auVar23._24_4_ = auVar84._24_4_ * 0.0;
    auVar23._28_4_ = auVar64._28_4_;
    auVar85 = vfmadd231ps_avx512vl(auVar22,auVar69,auVar78);
    auVar80 = vfmadd231ps_avx512vl(auVar23,auVar66,auVar69);
    auVar69 = vsubps_avx512vl(auVar79,auVar78);
    auVar84 = vsubps_avx512vl(auVar84,auVar66);
    auVar69 = vmulps_avx512vl(auVar69,auVar68);
    auVar84 = vmulps_avx512vl(auVar84,auVar68);
    fVar195 = fVar102 * auVar69._0_4_;
    fVar208 = fVar102 * auVar69._4_4_;
    auVar24._4_4_ = fVar208;
    auVar24._0_4_ = fVar195;
    fVar209 = fVar102 * auVar69._8_4_;
    auVar24._8_4_ = fVar209;
    fVar216 = fVar102 * auVar69._12_4_;
    auVar24._12_4_ = fVar216;
    fVar224 = fVar102 * auVar69._16_4_;
    auVar24._16_4_ = fVar224;
    fVar225 = fVar102 * auVar69._20_4_;
    auVar24._20_4_ = fVar225;
    fVar102 = fVar102 * auVar69._24_4_;
    auVar24._24_4_ = fVar102;
    auVar24._28_4_ = auVar69._28_4_;
    auVar84 = vmulps_avx512vl(auVar193,auVar84);
    auVar68 = vpermt2ps_avx512vl(auVar85,_DAT_0205fd20,auVar86);
    auVar78 = vpermt2ps_avx512vl(auVar80,_DAT_0205fd20,auVar86);
    auVar194._0_4_ = auVar85._0_4_ + fVar195;
    auVar194._4_4_ = auVar85._4_4_ + fVar208;
    auVar194._8_4_ = auVar85._8_4_ + fVar209;
    auVar194._12_4_ = auVar85._12_4_ + fVar216;
    auVar194._16_4_ = auVar85._16_4_ + fVar224;
    auVar194._20_4_ = auVar85._20_4_ + fVar225;
    auVar194._24_4_ = auVar85._24_4_ + fVar102;
    auVar194._28_4_ = auVar85._28_4_ + auVar69._28_4_;
    auVar69 = vpermt2ps_avx512vl(auVar24,_DAT_0205fd20,ZEXT1632(auVar40));
    auVar66 = vaddps_avx512vl(auVar80,auVar84);
    auVar84 = vpermt2ps_avx512vl(auVar84,_DAT_0205fd20,ZEXT1632(auVar40));
    auVar69 = vsubps_avx(auVar68,auVar69);
    auVar84 = vsubps_avx512vl(auVar78,auVar84);
    auVar134 = ZEXT1632(auVar118);
    auVar79 = vsubps_avx512vl(auVar85,auVar134);
    auVar143 = ZEXT1632(auVar54);
    auVar64 = vsubps_avx512vl(auVar80,auVar143);
    auVar65 = vsubps_avx512vl(auVar68,auVar74);
    auVar79 = vaddps_avx512vl(auVar79,auVar65);
    auVar65 = vsubps_avx512vl(auVar78,auVar75);
    auVar64 = vaddps_avx512vl(auVar64,auVar65);
    auVar65 = vmulps_avx512vl(auVar143,auVar79);
    auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar134,auVar64);
    auVar81 = vmulps_avx512vl(auVar77,auVar79);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar117,auVar64);
    auVar82 = vmulps_avx512vl(auVar76,auVar79);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar67,auVar64);
    auVar83 = vmulps_avx512vl(auVar75,auVar79);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar74,auVar64);
    auVar86 = vmulps_avx512vl(auVar80,auVar79);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar85,auVar64);
    auVar87 = vmulps_avx512vl(auVar66,auVar79);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar194,auVar64);
    auVar88 = vmulps_avx512vl(auVar84,auVar79);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar69,auVar64);
    auVar79 = vmulps_avx512vl(auVar78,auVar79);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar68,auVar64);
    auVar64 = vminps_avx512vl(auVar65,auVar81);
    auVar65 = vmaxps_avx512vl(auVar65,auVar81);
    auVar81 = vminps_avx512vl(auVar82,auVar83);
    auVar64 = vminps_avx512vl(auVar64,auVar81);
    auVar81 = vmaxps_avx512vl(auVar82,auVar83);
    auVar65 = vmaxps_avx512vl(auVar65,auVar81);
    auVar81 = vminps_avx512vl(auVar86,auVar87);
    auVar82 = vmaxps_avx512vl(auVar86,auVar87);
    auVar83 = vminps_avx512vl(auVar88,auVar79);
    auVar81 = vminps_avx512vl(auVar81,auVar83);
    auVar64 = vminps_avx512vl(auVar64,auVar81);
    auVar79 = vmaxps_avx512vl(auVar88,auVar79);
    auVar79 = vmaxps_avx512vl(auVar82,auVar79);
    auVar79 = vmaxps_avx512vl(auVar65,auVar79);
    uVar14 = vcmpps_avx512vl(auVar64,local_78,2);
    uVar15 = vcmpps_avx512vl(auVar79,local_98,5);
    uVar32 = 0;
    bVar28 = (byte)uVar14 & (byte)uVar15 & 0x7f;
    if (bVar28 != 0) {
      auVar79 = vsubps_avx512vl(auVar74,auVar134);
      auVar64 = vsubps_avx512vl(auVar75,auVar143);
      auVar65 = vsubps_avx512vl(auVar68,auVar85);
      auVar79 = vaddps_avx512vl(auVar79,auVar65);
      auVar65 = vsubps_avx512vl(auVar78,auVar80);
      auVar64 = vaddps_avx512vl(auVar64,auVar65);
      auVar65 = vmulps_avx512vl(auVar143,auVar79);
      auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar64,auVar134);
      auVar77 = vmulps_avx512vl(auVar77,auVar79);
      auVar77 = vfnmadd213ps_avx512vl(auVar117,auVar64,auVar77);
      auVar76 = vmulps_avx512vl(auVar76,auVar79);
      auVar76 = vfnmadd213ps_avx512vl(auVar67,auVar64,auVar76);
      auVar67 = vmulps_avx512vl(auVar75,auVar79);
      auVar75 = vfnmadd231ps_avx512vl(auVar67,auVar64,auVar74);
      auVar67 = vmulps_avx512vl(auVar80,auVar79);
      auVar85 = vfnmadd231ps_avx512vl(auVar67,auVar64,auVar85);
      auVar67 = vmulps_avx512vl(auVar66,auVar79);
      auVar66 = vfnmadd213ps_avx512vl(auVar194,auVar64,auVar67);
      auVar67 = vmulps_avx512vl(auVar84,auVar79);
      auVar80 = vfnmadd213ps_avx512vl(auVar69,auVar64,auVar67);
      auVar69 = vmulps_avx512vl(auVar78,auVar79);
      auVar68 = vfnmadd231ps_avx512vl(auVar69,auVar68,auVar64);
      auVar67 = vminps_avx(auVar65,auVar77);
      auVar69 = vmaxps_avx(auVar65,auVar77);
      auVar74 = vminps_avx(auVar76,auVar75);
      auVar74 = vminps_avx(auVar67,auVar74);
      auVar67 = vmaxps_avx(auVar76,auVar75);
      auVar69 = vmaxps_avx(auVar69,auVar67);
      auVar84 = vminps_avx(auVar85,auVar66);
      auVar67 = vmaxps_avx(auVar85,auVar66);
      auVar85 = vminps_avx(auVar80,auVar68);
      auVar84 = vminps_avx(auVar84,auVar85);
      auVar84 = vminps_avx(auVar74,auVar84);
      auVar74 = vmaxps_avx(auVar80,auVar68);
      auVar67 = vmaxps_avx(auVar67,auVar74);
      auVar69 = vmaxps_avx(auVar69,auVar67);
      uVar14 = vcmpps_avx512vl(auVar69,local_98,5);
      uVar15 = vcmpps_avx512vl(auVar84,local_78,2);
      uVar32 = (uint)(bVar28 & (byte)uVar14 & (byte)uVar15);
    }
    if (uVar32 != 0) {
      auStack_2f8[uVar30] = uVar32;
      uVar14 = vmovlps_avx(auVar50);
      *(undefined8 *)(&uStack_168 + uVar30 * 2) = uVar14;
      uVar35 = vmovlps_avx512f(auVar52);
      auStack_58[uVar30] = uVar35;
      uVar30 = (ulong)((int)uVar30 + 1);
    }
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar248 = ZEXT1664(auVar50);
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar249 = ZEXT1664(auVar50);
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar250 = ZEXT1664(auVar50);
    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar251 = ZEXT3264(auVar69);
    auVar252 = ZEXT464(0x3f800000);
    auVar50 = auVar69._16_16_;
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar253 = ZEXT1664(auVar45);
    do {
      auVar45 = auVar253._0_16_;
      auVar44 = auVar257._0_16_;
      if ((int)uVar30 == 0) {
        uVar108 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar17._4_4_ = uVar108;
        auVar17._0_4_ = uVar108;
        auVar17._8_4_ = uVar108;
        auVar17._12_4_ = uVar108;
        auVar17._16_4_ = uVar108;
        auVar17._20_4_ = uVar108;
        auVar17._24_4_ = uVar108;
        auVar17._28_4_ = uVar108;
        uVar14 = vcmpps_avx512vl(local_b8,auVar17,2);
        uVar36 = (uint)uVar37 & (uint)uVar14;
        uVar37 = (ulong)uVar36;
        if (uVar36 == 0) {
          return;
        }
        goto LAB_01d620f4;
      }
      uVar29 = (int)uVar30 - 1;
      uVar31 = (ulong)uVar29;
      uVar32 = (&uStack_168)[uVar31 * 2];
      fVar102 = afStack_164[uVar31 * 2];
      uVar5 = auStack_2f8[uVar31];
      auVar245._8_8_ = 0;
      auVar245._0_8_ = auStack_58[uVar31];
      auVar247 = ZEXT1664(auVar245);
      lVar34 = 0;
      for (uVar35 = (ulong)uVar5; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
        lVar34 = lVar34 + 1;
      }
      uVar33 = uVar5 - 1 & uVar5;
      auStack_2f8[uVar31] = uVar33;
      if (uVar33 == 0) {
        uVar30 = (ulong)uVar29;
      }
      auVar119._0_4_ = (float)lVar34;
      auVar119._4_8_ = SUB128(ZEXT812(0),4);
      auVar119._12_4_ = 0;
      auVar50 = vmulss_avx512f(auVar119,SUB6416(ZEXT464(0x3e124925),0));
      lVar34 = lVar34 + 1;
      auVar43 = vmulss_avx512f(ZEXT416((uint)(float)lVar34),SUB6416(ZEXT464(0x3e124925),0));
      auVar118 = auVar252._0_16_;
      auVar40 = vsubss_avx512f(auVar118,auVar50);
      auVar50 = vmulss_avx512f(ZEXT416((uint)fVar102),auVar50);
      auVar40 = vfmadd231ss_avx512f(auVar50,ZEXT416(uVar32),auVar40);
      auVar50 = vsubss_avx512f(auVar118,auVar43);
      auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar102 * auVar43._0_4_)),ZEXT416(uVar32),auVar50);
      auVar51 = vsubss_avx512f(auVar43,auVar40);
      vucomiss_avx512f(auVar51);
      if (uVar5 == 0 || lVar34 == 0) break;
      auVar50 = vshufps_avx(auVar245,auVar245,0x50);
      vucomiss_avx512f(auVar51);
      auVar52 = vsubps_avx512vl(auVar45,auVar50);
      fVar102 = auVar50._0_4_;
      auVar130._0_4_ = fVar105 * fVar102;
      fVar195 = auVar50._4_4_;
      auVar130._4_4_ = fVar106 * fVar195;
      fVar208 = auVar50._8_4_;
      auVar130._8_4_ = fVar105 * fVar208;
      fVar209 = auVar50._12_4_;
      auVar130._12_4_ = fVar106 * fVar209;
      auVar139._0_4_ = fVar107 * fVar102;
      auVar139._4_4_ = fVar127 * fVar195;
      auVar139._8_4_ = fVar107 * fVar208;
      auVar139._12_4_ = fVar127 * fVar209;
      auVar149._0_4_ = fVar137 * fVar102;
      auVar149._4_4_ = fVar145 * fVar195;
      auVar149._8_4_ = fVar137 * fVar208;
      auVar149._12_4_ = fVar145 * fVar209;
      auVar111._0_4_ = fVar146 * fVar102;
      auVar111._4_4_ = fVar147 * fVar195;
      auVar111._8_4_ = fVar146 * fVar208;
      auVar111._12_4_ = fVar147 * fVar209;
      auVar50 = vfmadd231ps_fma(auVar130,auVar52,local_308);
      auVar54 = vfmadd231ps_fma(auVar139,auVar52,local_318);
      auVar53 = vfmadd231ps_avx512vl(auVar149,auVar52,auVar42);
      auVar52 = vfmadd231ps_fma(auVar111,auVar157,auVar52);
      auVar126._16_16_ = auVar50;
      auVar126._0_16_ = auVar50;
      auVar135._16_16_ = auVar54;
      auVar135._0_16_ = auVar54;
      auVar144._16_16_ = auVar53;
      auVar144._0_16_ = auVar53;
      uVar108 = auVar40._0_4_;
      auVar162._4_4_ = uVar108;
      auVar162._0_4_ = uVar108;
      auVar162._8_4_ = uVar108;
      auVar162._12_4_ = uVar108;
      uVar108 = auVar43._0_4_;
      auVar162._20_4_ = uVar108;
      auVar162._16_4_ = uVar108;
      auVar162._24_4_ = uVar108;
      auVar162._28_4_ = uVar108;
      auVar69 = vsubps_avx(auVar135,auVar126);
      auVar54 = vfmadd213ps_fma(auVar69,auVar162,auVar126);
      auVar69 = vsubps_avx(auVar144,auVar135);
      auVar63 = vfmadd213ps_fma(auVar69,auVar162,auVar135);
      auVar50 = vsubps_avx(auVar52,auVar53);
      auVar136._16_16_ = auVar50;
      auVar136._0_16_ = auVar50;
      auVar50 = vfmadd213ps_fma(auVar136,auVar162,auVar144);
      auVar69 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar54));
      auVar54 = vfmadd213ps_fma(auVar69,auVar162,ZEXT1632(auVar54));
      auVar69 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar63));
      auVar50 = vfmadd213ps_fma(auVar69,auVar162,ZEXT1632(auVar63));
      auVar69 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar54));
      auVar156 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar69,auVar162);
      auVar69 = vmulps_avx512vl(auVar69,auVar251._0_32_);
      auVar50 = auVar69._16_16_;
      fVar102 = auVar51._0_4_ * 0.33333334;
      auVar150._0_8_ =
           CONCAT44(auVar156._4_4_ + fVar102 * auVar69._4_4_,
                    auVar156._0_4_ + fVar102 * auVar69._0_4_);
      auVar150._8_4_ = auVar156._8_4_ + fVar102 * auVar69._8_4_;
      auVar150._12_4_ = auVar156._12_4_ + fVar102 * auVar69._12_4_;
      auVar131._0_4_ = fVar102 * auVar69._16_4_;
      auVar131._4_4_ = fVar102 * auVar69._20_4_;
      auVar131._8_4_ = fVar102 * auVar69._24_4_;
      auVar131._12_4_ = fVar102 * auVar69._28_4_;
      auVar154 = vsubps_avx((undefined1  [16])0x0,auVar131);
      auVar61 = vshufpd_avx(auVar156,auVar156,3);
      auVar58 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar54 = vsubps_avx(auVar61,auVar156);
      auVar52 = vsubps_avx(auVar58,(undefined1  [16])0x0);
      auVar164._0_4_ = auVar52._0_4_ + auVar54._0_4_;
      auVar164._4_4_ = auVar52._4_4_ + auVar54._4_4_;
      auVar164._8_4_ = auVar52._8_4_ + auVar54._8_4_;
      auVar164._12_4_ = auVar52._12_4_ + auVar54._12_4_;
      auVar54 = vshufps_avx(auVar156,auVar156,0xb1);
      auVar52 = vshufps_avx(auVar150,auVar150,0xb1);
      auVar63 = vshufps_avx(auVar154,auVar154,0xb1);
      auVar53 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar218._4_4_ = auVar164._0_4_;
      auVar218._0_4_ = auVar164._0_4_;
      auVar218._8_4_ = auVar164._0_4_;
      auVar218._12_4_ = auVar164._0_4_;
      auVar59 = vshufps_avx(auVar164,auVar164,0x55);
      fVar102 = auVar59._0_4_;
      auVar179._0_4_ = auVar54._0_4_ * fVar102;
      fVar195 = auVar59._4_4_;
      auVar179._4_4_ = auVar54._4_4_ * fVar195;
      fVar208 = auVar59._8_4_;
      auVar179._8_4_ = auVar54._8_4_ * fVar208;
      fVar209 = auVar59._12_4_;
      auVar179._12_4_ = auVar54._12_4_ * fVar209;
      auVar189._0_4_ = auVar52._0_4_ * fVar102;
      auVar189._4_4_ = auVar52._4_4_ * fVar195;
      auVar189._8_4_ = auVar52._8_4_ * fVar208;
      auVar189._12_4_ = auVar52._12_4_ * fVar209;
      auVar198._0_4_ = auVar63._0_4_ * fVar102;
      auVar198._4_4_ = auVar63._4_4_ * fVar195;
      auVar198._8_4_ = auVar63._8_4_ * fVar208;
      auVar198._12_4_ = auVar63._12_4_ * fVar209;
      auVar165._0_4_ = auVar53._0_4_ * fVar102;
      auVar165._4_4_ = auVar53._4_4_ * fVar195;
      auVar165._8_4_ = auVar53._8_4_ * fVar208;
      auVar165._12_4_ = auVar53._12_4_ * fVar209;
      auVar54 = vfmadd231ps_fma(auVar179,auVar218,auVar156);
      auVar52 = vfmadd231ps_fma(auVar189,auVar218,auVar150);
      auVar59 = vfmadd231ps_fma(auVar198,auVar218,auVar154);
      auVar155 = vfmadd231ps_fma(auVar165,(undefined1  [16])0x0,auVar218);
      auVar60 = vshufpd_avx(auVar54,auVar54,1);
      auVar55 = vshufpd_avx(auVar52,auVar52,1);
      auVar56 = vshufpd_avx(auVar59,auVar59,1);
      auVar57 = vshufpd_avx(auVar155,auVar155,1);
      auVar63 = vminss_avx(auVar54,auVar52);
      auVar54 = vmaxss_avx(auVar52,auVar54);
      auVar53 = vminss_avx(auVar59,auVar155);
      auVar52 = vmaxss_avx(auVar155,auVar59);
      auVar53 = vminss_avx(auVar63,auVar53);
      auVar54 = vmaxss_avx(auVar52,auVar54);
      auVar59 = vminss_avx(auVar60,auVar55);
      auVar52 = vmaxss_avx(auVar55,auVar60);
      auVar60 = vminss_avx(auVar56,auVar57);
      auVar63 = vmaxss_avx(auVar57,auVar56);
      auVar59 = vminss_avx(auVar59,auVar60);
      auVar52 = vmaxss_avx(auVar63,auVar52);
      fVar208 = auVar53._0_4_;
      fVar195 = auVar52._0_4_;
      fVar102 = auVar54._0_4_;
      if ((0.0001 <= fVar208) || (fVar195 <= -0.0001)) {
        uVar14 = vcmpps_avx512vl(auVar59,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar15 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar102 & ((byte)uVar15 | (byte)uVar14)) != 0) goto LAB_01d63053;
        uVar14 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar52,5);
        uVar15 = vcmpps_avx512vl(auVar59,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar15 | (ushort)uVar14) & 1) == 0) goto LAB_01d63053;
        bVar12 = true;
        auVar247 = ZEXT1664(auVar245);
      }
      else {
LAB_01d63053:
        auVar55 = auVar256._0_16_;
        uVar14 = vcmpss_avx512f(auVar53,auVar55,1);
        bVar12 = (bool)((byte)uVar14 & 1);
        iVar101 = auVar252._0_4_;
        fVar209 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * iVar101);
        uVar14 = vcmpss_avx512f(auVar54,auVar55,1);
        bVar12 = (bool)((byte)uVar14 & 1);
        fVar216 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * iVar101);
        bVar12 = fVar209 != fVar216;
        iVar255 = auVar256._0_4_;
        auVar90._16_16_ = auVar50;
        auVar90._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar89._4_28_ = auVar90._4_28_;
        auVar89._0_4_ = (uint)bVar12 * iVar255 + (uint)!bVar12 * 0x7f800000;
        auVar60 = auVar89._0_16_;
        auVar92._16_16_ = auVar50;
        auVar92._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar91._4_28_ = auVar92._4_28_;
        auVar91._0_4_ = (uint)bVar12 * iVar255 + (uint)!bVar12 * -0x800000;
        auVar63 = auVar91._0_16_;
        uVar14 = vcmpss_avx512f(auVar59,auVar55,1);
        bVar12 = (bool)((byte)uVar14 & 1);
        fVar224 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * iVar101);
        if ((fVar209 != fVar224) || (NAN(fVar209) || NAN(fVar224))) {
          fVar209 = auVar59._0_4_;
          bVar12 = fVar209 == fVar208;
          if ((!bVar12) || (NAN(fVar209) || NAN(fVar208))) {
            auVar53 = vxorps_avx512vl(auVar53,auVar250._0_16_);
            auVar239._0_4_ = auVar53._0_4_ / (fVar209 - fVar208);
            auVar239._4_12_ = auVar53._4_12_;
            auVar53 = vsubss_avx512f(auVar118,auVar239);
            auVar59 = vfmadd213ss_avx512f(auVar53,auVar55,auVar239);
            auVar53 = auVar59;
          }
          else {
            vucomiss_avx512f(auVar55);
            auVar94._16_16_ = auVar50;
            auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar93._4_28_ = auVar94._4_28_;
            auVar93._0_4_ = (uint)bVar12 * iVar255 + (uint)!bVar12 * 0x7f800000;
            auVar59 = auVar93._0_16_;
            auVar53 = ZEXT416((uint)bVar12 * 0x3f800000 + (uint)!bVar12 * -0x800000);
          }
          auVar60 = vminss_avx(auVar60,auVar59);
          auVar63 = vmaxss_avx(auVar53,auVar63);
        }
        auVar247 = ZEXT1664(auVar245);
        uVar14 = vcmpss_avx512f(auVar52,auVar55,1);
        bVar12 = (bool)((byte)uVar14 & 1);
        fVar208 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * iVar101);
        if ((fVar216 != fVar208) || (NAN(fVar216) || NAN(fVar208))) {
          bVar12 = fVar195 == fVar102;
          if ((!bVar12) || (NAN(fVar195) || NAN(fVar102))) {
            auVar54 = vxorps_avx512vl(auVar54,auVar250._0_16_);
            auVar199._0_4_ = auVar54._0_4_ / (fVar195 - fVar102);
            auVar199._4_12_ = auVar54._4_12_;
            auVar54 = vsubss_avx512f(auVar118,auVar199);
            auVar52 = vfmadd213ss_avx512f(auVar54,auVar55,auVar199);
            auVar54 = auVar52;
          }
          else {
            vucomiss_avx512f(auVar55);
            auVar96._16_16_ = auVar50;
            auVar96._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar95._4_28_ = auVar96._4_28_;
            auVar95._0_4_ = (uint)bVar12 * iVar255 + (uint)!bVar12 * 0x7f800000;
            auVar52 = auVar95._0_16_;
            auVar54 = ZEXT416((uint)bVar12 * 0x3f800000 + (uint)!bVar12 * -0x800000);
          }
          auVar60 = vminss_avx(auVar60,auVar52);
          auVar63 = vmaxss_avx(auVar54,auVar63);
        }
        bVar12 = fVar224 != fVar208;
        auVar54 = vminss_avx512f(auVar60,auVar118);
        auVar98._16_16_ = auVar50;
        auVar98._0_16_ = auVar60;
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar12 * auVar54._0_4_ + (uint)!bVar12 * auVar60._0_4_;
        auVar54 = vmaxss_avx512f(auVar118,auVar63);
        auVar100._16_16_ = auVar50;
        auVar100._0_16_ = auVar63;
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (uint)bVar12 * auVar54._0_4_ + (uint)!bVar12 * auVar63._0_4_;
        auVar54 = vmaxss_avx512f(auVar55,auVar97._0_16_);
        auVar52 = vminss_avx512f(auVar99._0_16_,auVar118);
        bVar12 = true;
        if (auVar54._0_4_ <= auVar52._0_4_) {
          auVar55 = vmaxss_avx512f(auVar55,ZEXT416((uint)(auVar54._0_4_ + -0.1)));
          auVar56 = vminss_avx512f(ZEXT416((uint)(auVar52._0_4_ + 0.1)),auVar118);
          auVar112._0_8_ = auVar156._0_8_;
          auVar112._8_8_ = auVar112._0_8_;
          auVar190._8_8_ = auVar150._0_8_;
          auVar190._0_8_ = auVar150._0_8_;
          auVar200._8_8_ = auVar154._0_8_;
          auVar200._0_8_ = auVar154._0_8_;
          auVar54 = vshufpd_avx(auVar150,auVar150,3);
          auVar52 = vshufpd_avx(auVar154,auVar154,3);
          auVar63 = vshufps_avx(auVar55,auVar56,0);
          auVar57 = vsubps_avx512vl(auVar45,auVar63);
          fVar102 = auVar63._0_4_;
          auVar229._0_4_ = fVar102 * auVar61._0_4_;
          fVar195 = auVar63._4_4_;
          auVar229._4_4_ = fVar195 * auVar61._4_4_;
          fVar208 = auVar63._8_4_;
          auVar229._8_4_ = fVar208 * auVar61._8_4_;
          fVar209 = auVar63._12_4_;
          auVar229._12_4_ = fVar209 * auVar61._12_4_;
          auVar151._0_4_ = fVar102 * auVar54._0_4_;
          auVar151._4_4_ = fVar195 * auVar54._4_4_;
          auVar151._8_4_ = fVar208 * auVar54._8_4_;
          auVar151._12_4_ = fVar209 * auVar54._12_4_;
          auVar158._0_4_ = fVar102 * auVar52._0_4_;
          auVar158._4_4_ = fVar195 * auVar52._4_4_;
          auVar158._8_4_ = fVar208 * auVar52._8_4_;
          auVar158._12_4_ = fVar209 * auVar52._12_4_;
          auVar132._0_4_ = fVar102 * auVar58._0_4_;
          auVar132._4_4_ = fVar195 * auVar58._4_4_;
          auVar132._8_4_ = fVar208 * auVar58._8_4_;
          auVar132._12_4_ = fVar209 * auVar58._12_4_;
          auVar53 = vfmadd231ps_fma(auVar229,auVar57,auVar112);
          auVar59 = vfmadd231ps_fma(auVar151,auVar57,auVar190);
          auVar60 = vfmadd231ps_fma(auVar158,auVar57,auVar200);
          auVar61 = vfmadd231ps_fma(auVar132,auVar57,ZEXT816(0));
          auVar52 = vsubss_avx512f(auVar118,auVar55);
          auVar54 = vmovshdup_avx(auVar245);
          auVar155 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * auVar55._0_4_)),auVar245,auVar52
                                    );
          auVar52 = vsubss_avx512f(auVar118,auVar56);
          auVar156 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * auVar54._0_4_)),auVar245,auVar52
                                    );
          auVar58 = vdivss_avx512f(auVar118,auVar51);
          auVar51 = vsubps_avx(auVar59,auVar53);
          auVar120._0_4_ = auVar51._0_4_ * 3.0;
          auVar120._4_4_ = auVar51._4_4_ * 3.0;
          auVar120._8_4_ = auVar51._8_4_ * 3.0;
          auVar120._12_4_ = auVar51._12_4_ * 3.0;
          auVar51 = vsubps_avx(auVar60,auVar59);
          auVar166._0_4_ = auVar51._0_4_ * 3.0;
          auVar166._4_4_ = auVar51._4_4_ * 3.0;
          auVar166._8_4_ = auVar51._8_4_ * 3.0;
          auVar166._12_4_ = auVar51._12_4_ * 3.0;
          auVar51 = vsubps_avx(auVar61,auVar60);
          auVar180._0_4_ = auVar51._0_4_ * 3.0;
          auVar180._4_4_ = auVar51._4_4_ * 3.0;
          auVar180._8_4_ = auVar51._8_4_ * 3.0;
          auVar180._12_4_ = auVar51._12_4_ * 3.0;
          auVar54 = vminps_avx(auVar166,auVar180);
          auVar51 = vmaxps_avx(auVar166,auVar180);
          auVar54 = vminps_avx(auVar120,auVar54);
          auVar51 = vmaxps_avx(auVar120,auVar51);
          auVar52 = vshufpd_avx(auVar54,auVar54,3);
          auVar63 = vshufpd_avx(auVar51,auVar51,3);
          auVar54 = vminps_avx(auVar54,auVar52);
          auVar51 = vmaxps_avx(auVar51,auVar63);
          fVar102 = auVar58._0_4_;
          auVar181._0_4_ = fVar102 * auVar54._0_4_;
          auVar181._4_4_ = fVar102 * auVar54._4_4_;
          auVar181._8_4_ = fVar102 * auVar54._8_4_;
          auVar181._12_4_ = fVar102 * auVar54._12_4_;
          auVar167._0_4_ = fVar102 * auVar51._0_4_;
          auVar167._4_4_ = fVar102 * auVar51._4_4_;
          auVar167._8_4_ = fVar102 * auVar51._8_4_;
          auVar167._12_4_ = fVar102 * auVar51._12_4_;
          auVar58 = vdivss_avx512f(auVar118,ZEXT416((uint)(auVar156._0_4_ - auVar155._0_4_)));
          auVar51 = vshufpd_avx(auVar53,auVar53,3);
          auVar54 = vshufpd_avx(auVar59,auVar59,3);
          auVar52 = vshufpd_avx(auVar60,auVar60,3);
          auVar63 = vshufpd_avx(auVar61,auVar61,3);
          auVar51 = vsubps_avx(auVar51,auVar53);
          auVar53 = vsubps_avx(auVar54,auVar59);
          auVar59 = vsubps_avx(auVar52,auVar60);
          auVar63 = vsubps_avx(auVar63,auVar61);
          auVar54 = vminps_avx(auVar51,auVar53);
          auVar51 = vmaxps_avx(auVar51,auVar53);
          auVar52 = vminps_avx(auVar59,auVar63);
          auVar52 = vminps_avx(auVar54,auVar52);
          auVar54 = vmaxps_avx(auVar59,auVar63);
          auVar51 = vmaxps_avx(auVar51,auVar54);
          fVar102 = auVar58._0_4_;
          auVar201._0_4_ = fVar102 * auVar52._0_4_;
          auVar201._4_4_ = fVar102 * auVar52._4_4_;
          auVar201._8_4_ = fVar102 * auVar52._8_4_;
          auVar201._12_4_ = fVar102 * auVar52._12_4_;
          auVar211._0_4_ = fVar102 * auVar51._0_4_;
          auVar211._4_4_ = fVar102 * auVar51._4_4_;
          auVar211._8_4_ = fVar102 * auVar51._8_4_;
          auVar211._12_4_ = fVar102 * auVar51._12_4_;
          auVar154 = vinsertps_avx512f(auVar40,auVar155,0x10);
          auVar53 = vinsertps_avx(auVar43,auVar156,0x10);
          auVar104._0_4_ = auVar154._0_4_ + auVar53._0_4_;
          auVar104._4_4_ = auVar154._4_4_ + auVar53._4_4_;
          auVar104._8_4_ = auVar154._8_4_ + auVar53._8_4_;
          auVar104._12_4_ = auVar154._12_4_ + auVar53._12_4_;
          auVar56 = vmulps_avx512vl(auVar104,auVar248._0_16_);
          auVar52 = vshufps_avx(auVar56,auVar56,0x54);
          uVar108 = auVar56._0_4_;
          auVar121._4_4_ = uVar108;
          auVar121._0_4_ = uVar108;
          auVar121._8_4_ = uVar108;
          auVar121._12_4_ = uVar108;
          auVar59 = vfmadd213ps_avx512vl(auVar38,auVar121,auVar49);
          auVar54 = vfmadd213ps_fma(auVar47,auVar121,auVar48);
          auVar63 = vfmadd213ps_fma(local_178,auVar121,auVar46);
          auVar51 = vsubps_avx(auVar54,auVar59);
          auVar59 = vfmadd213ps_fma(auVar51,auVar121,auVar59);
          auVar51 = vsubps_avx(auVar63,auVar54);
          auVar51 = vfmadd213ps_fma(auVar51,auVar121,auVar54);
          auVar51 = vsubps_avx(auVar51,auVar59);
          auVar54 = vfmadd231ps_fma(auVar59,auVar51,auVar121);
          auVar122._0_8_ = CONCAT44(auVar51._4_4_ * 3.0,auVar51._0_4_ * 3.0);
          auVar122._8_4_ = auVar51._8_4_ * 3.0;
          auVar122._12_4_ = auVar51._12_4_ * 3.0;
          auVar219._8_8_ = auVar54._0_8_;
          auVar219._0_8_ = auVar54._0_8_;
          auVar51 = vshufpd_avx(auVar54,auVar54,3);
          auVar54 = vshufps_avx(auVar56,auVar56,0x55);
          auVar63 = vsubps_avx(auVar51,auVar219);
          auVar59 = vfmadd231ps_fma(auVar219,auVar54,auVar63);
          auVar240._8_8_ = auVar122._0_8_;
          auVar240._0_8_ = auVar122._0_8_;
          auVar51 = vshufpd_avx(auVar122,auVar122,3);
          auVar51 = vsubps_avx(auVar51,auVar240);
          auVar54 = vfmadd213ps_fma(auVar51,auVar54,auVar240);
          auVar123._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
          auVar123._8_4_ = auVar63._8_4_ ^ 0x80000000;
          auVar123._12_4_ = auVar63._12_4_ ^ 0x80000000;
          auVar51 = vmovshdup_avx(auVar54);
          auVar241._0_8_ = auVar51._0_8_ ^ 0x8000000080000000;
          auVar241._8_4_ = auVar51._8_4_ ^ 0x80000000;
          auVar241._12_4_ = auVar51._12_4_ ^ 0x80000000;
          auVar60 = vmovshdup_avx512vl(auVar63);
          auVar61 = vpermt2ps_avx512vl(auVar241,ZEXT416(5),auVar63);
          auVar51 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar51._0_4_ * auVar63._0_4_)),auVar54,
                                        auVar60);
          auVar54 = vpermt2ps_avx512vl(auVar54,SUB6416(ZEXT464(4),0),auVar123);
          auVar133._0_4_ = auVar51._0_4_;
          auVar133._4_4_ = auVar133._0_4_;
          auVar133._8_4_ = auVar133._0_4_;
          auVar133._12_4_ = auVar133._0_4_;
          auVar51 = vdivps_avx(auVar61,auVar133);
          auVar54 = vdivps_avx(auVar54,auVar133);
          fVar195 = auVar59._0_4_;
          auVar63 = vshufps_avx(auVar59,auVar59,0x55);
          fVar102 = auVar54._0_4_;
          auVar220._0_4_ = fVar195 * auVar51._0_4_ + auVar63._0_4_ * fVar102;
          auVar220._4_4_ = fVar195 * auVar51._4_4_ + auVar63._4_4_ * auVar54._4_4_;
          auVar220._8_4_ = fVar195 * auVar51._8_4_ + auVar63._8_4_ * auVar54._8_4_;
          auVar220._12_4_ = fVar195 * auVar51._12_4_ + auVar63._12_4_ * auVar54._12_4_;
          auVar57 = vsubps_avx(auVar52,auVar220);
          auVar59 = vmovshdup_avx(auVar51);
          auVar52 = vinsertps_avx(auVar181,auVar201,0x1c);
          auVar242._0_4_ = auVar59._0_4_ * auVar52._0_4_;
          auVar242._4_4_ = auVar59._4_4_ * auVar52._4_4_;
          auVar242._8_4_ = auVar59._8_4_ * auVar52._8_4_;
          auVar242._12_4_ = auVar59._12_4_ * auVar52._12_4_;
          auVar63 = vinsertps_avx(auVar167,auVar211,0x1c);
          auVar221._0_4_ = auVar59._0_4_ * auVar63._0_4_;
          auVar221._4_4_ = auVar59._4_4_ * auVar63._4_4_;
          auVar221._8_4_ = auVar59._8_4_ * auVar63._8_4_;
          auVar221._12_4_ = auVar59._12_4_ * auVar63._12_4_;
          auVar55 = vminps_avx512vl(auVar242,auVar221);
          auVar61 = vmaxps_avx(auVar221,auVar242);
          auVar58 = vmovshdup_avx(auVar54);
          auVar59 = vinsertps_avx(auVar201,auVar181,0x4c);
          auVar202._0_4_ = auVar58._0_4_ * auVar59._0_4_;
          auVar202._4_4_ = auVar58._4_4_ * auVar59._4_4_;
          auVar202._8_4_ = auVar58._8_4_ * auVar59._8_4_;
          auVar202._12_4_ = auVar58._12_4_ * auVar59._12_4_;
          auVar60 = vinsertps_avx(auVar211,auVar167,0x4c);
          auVar212._0_4_ = auVar58._0_4_ * auVar60._0_4_;
          auVar212._4_4_ = auVar58._4_4_ * auVar60._4_4_;
          auVar212._8_4_ = auVar58._8_4_ * auVar60._8_4_;
          auVar212._12_4_ = auVar58._12_4_ * auVar60._12_4_;
          auVar58 = vminps_avx(auVar202,auVar212);
          auVar55 = vaddps_avx512vl(auVar55,auVar58);
          auVar58 = vmaxps_avx(auVar212,auVar202);
          auVar203._0_4_ = auVar61._0_4_ + auVar58._0_4_;
          auVar203._4_4_ = auVar61._4_4_ + auVar58._4_4_;
          auVar203._8_4_ = auVar61._8_4_ + auVar58._8_4_;
          auVar203._12_4_ = auVar61._12_4_ + auVar58._12_4_;
          auVar213._8_8_ = 0x3f80000000000000;
          auVar213._0_8_ = 0x3f80000000000000;
          auVar61 = vsubps_avx(auVar213,auVar203);
          auVar58 = vsubps_avx(auVar213,auVar55);
          auVar55 = vsubps_avx(auVar154,auVar56);
          auVar56 = vsubps_avx(auVar53,auVar56);
          fVar224 = auVar55._0_4_;
          auVar243._0_4_ = fVar224 * auVar61._0_4_;
          fVar225 = auVar55._4_4_;
          auVar243._4_4_ = fVar225 * auVar61._4_4_;
          fVar226 = auVar55._8_4_;
          auVar243._8_4_ = fVar226 * auVar61._8_4_;
          fVar227 = auVar55._12_4_;
          auVar243._12_4_ = fVar227 * auVar61._12_4_;
          auVar62 = vbroadcastss_avx512vl(auVar51);
          auVar52 = vmulps_avx512vl(auVar62,auVar52);
          auVar63 = vmulps_avx512vl(auVar62,auVar63);
          auVar62 = vminps_avx512vl(auVar52,auVar63);
          auVar52 = vmaxps_avx(auVar63,auVar52);
          auVar182._0_4_ = fVar102 * auVar59._0_4_;
          auVar182._4_4_ = fVar102 * auVar59._4_4_;
          auVar182._8_4_ = fVar102 * auVar59._8_4_;
          auVar182._12_4_ = fVar102 * auVar59._12_4_;
          auVar168._0_4_ = fVar102 * auVar60._0_4_;
          auVar168._4_4_ = fVar102 * auVar60._4_4_;
          auVar168._8_4_ = fVar102 * auVar60._8_4_;
          auVar168._12_4_ = fVar102 * auVar60._12_4_;
          auVar63 = vminps_avx(auVar182,auVar168);
          auVar59 = vaddps_avx512vl(auVar62,auVar63);
          auVar60 = vmulps_avx512vl(auVar55,auVar58);
          fVar195 = auVar56._0_4_;
          auVar204._0_4_ = fVar195 * auVar61._0_4_;
          fVar208 = auVar56._4_4_;
          auVar204._4_4_ = fVar208 * auVar61._4_4_;
          fVar209 = auVar56._8_4_;
          auVar204._8_4_ = fVar209 * auVar61._8_4_;
          fVar216 = auVar56._12_4_;
          auVar204._12_4_ = fVar216 * auVar61._12_4_;
          auVar214._0_4_ = fVar195 * auVar58._0_4_;
          auVar214._4_4_ = fVar208 * auVar58._4_4_;
          auVar214._8_4_ = fVar209 * auVar58._8_4_;
          auVar214._12_4_ = fVar216 * auVar58._12_4_;
          auVar63 = vmaxps_avx(auVar168,auVar182);
          auVar169._0_4_ = auVar52._0_4_ + auVar63._0_4_;
          auVar169._4_4_ = auVar52._4_4_ + auVar63._4_4_;
          auVar169._8_4_ = auVar52._8_4_ + auVar63._8_4_;
          auVar169._12_4_ = auVar52._12_4_ + auVar63._12_4_;
          auVar183._8_8_ = 0x3f800000;
          auVar183._0_8_ = 0x3f800000;
          auVar52 = vsubps_avx(auVar183,auVar169);
          auVar63 = vsubps_avx(auVar183,auVar59);
          auVar230._0_4_ = fVar224 * auVar52._0_4_;
          auVar230._4_4_ = fVar225 * auVar52._4_4_;
          auVar230._8_4_ = fVar226 * auVar52._8_4_;
          auVar230._12_4_ = fVar227 * auVar52._12_4_;
          auVar222._0_4_ = fVar224 * auVar63._0_4_;
          auVar222._4_4_ = fVar225 * auVar63._4_4_;
          auVar222._8_4_ = fVar226 * auVar63._8_4_;
          auVar222._12_4_ = fVar227 * auVar63._12_4_;
          auVar170._0_4_ = fVar195 * auVar52._0_4_;
          auVar170._4_4_ = fVar208 * auVar52._4_4_;
          auVar170._8_4_ = fVar209 * auVar52._8_4_;
          auVar170._12_4_ = fVar216 * auVar52._12_4_;
          auVar184._0_4_ = fVar195 * auVar63._0_4_;
          auVar184._4_4_ = fVar208 * auVar63._4_4_;
          auVar184._8_4_ = fVar209 * auVar63._8_4_;
          auVar184._12_4_ = fVar216 * auVar63._12_4_;
          auVar52 = vminps_avx(auVar230,auVar222);
          auVar63 = vminps_avx(auVar170,auVar184);
          auVar59 = vminps_avx(auVar52,auVar63);
          auVar52 = vmaxps_avx(auVar222,auVar230);
          auVar63 = vmaxps_avx(auVar184,auVar170);
          auVar63 = vmaxps_avx(auVar63,auVar52);
          auVar61 = vminps_avx512vl(auVar243,auVar60);
          auVar52 = vminps_avx(auVar204,auVar214);
          auVar52 = vminps_avx(auVar61,auVar52);
          auVar52 = vhaddps_avx(auVar59,auVar52);
          auVar60 = vmaxps_avx512vl(auVar60,auVar243);
          auVar59 = vmaxps_avx(auVar214,auVar204);
          auVar59 = vmaxps_avx(auVar59,auVar60);
          auVar63 = vhaddps_avx(auVar63,auVar59);
          auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
          auVar63 = vshufps_avx(auVar63,auVar63,0xe8);
          auVar171._0_4_ = auVar52._0_4_ + auVar57._0_4_;
          auVar171._4_4_ = auVar52._4_4_ + auVar57._4_4_;
          auVar171._8_4_ = auVar52._8_4_ + auVar57._8_4_;
          auVar171._12_4_ = auVar52._12_4_ + auVar57._12_4_;
          auVar185._0_4_ = auVar63._0_4_ + auVar57._0_4_;
          auVar185._4_4_ = auVar63._4_4_ + auVar57._4_4_;
          auVar185._8_4_ = auVar63._8_4_ + auVar57._8_4_;
          auVar185._12_4_ = auVar63._12_4_ + auVar57._12_4_;
          auVar52 = vmaxps_avx(auVar154,auVar171);
          auVar63 = vminps_avx(auVar185,auVar53);
          uVar35 = vcmpps_avx512vl(auVar63,auVar52,1);
          local_348 = vinsertps_avx(auVar155,auVar156,0x10);
          auVar247 = ZEXT1664(local_348);
          auVar52 = ZEXT416(5);
          if ((uVar35 & 3) == 0) {
            vucomiss_avx512f(auVar40);
            auVar52 = vxorps_avx512vl(auVar52,auVar52);
            auVar256 = ZEXT1664(auVar52);
            if ((uint)uVar30 < 4 && (uVar5 == 0 || lVar34 == 0)) {
              bVar12 = false;
            }
            else {
              lVar34 = 200;
              do {
                auVar63 = vsubss_avx512f(auVar118,auVar57);
                fVar209 = auVar63._0_4_;
                fVar195 = fVar209 * fVar209 * fVar209;
                fVar216 = auVar57._0_4_;
                fVar208 = fVar216 * 3.0 * fVar209 * fVar209;
                fVar209 = fVar209 * fVar216 * fVar216 * 3.0;
                auVar152._4_4_ = fVar195;
                auVar152._0_4_ = fVar195;
                auVar152._8_4_ = fVar195;
                auVar152._12_4_ = fVar195;
                auVar140._4_4_ = fVar208;
                auVar140._0_4_ = fVar208;
                auVar140._8_4_ = fVar208;
                auVar140._12_4_ = fVar208;
                auVar113._4_4_ = fVar209;
                auVar113._0_4_ = fVar209;
                auVar113._8_4_ = fVar209;
                auVar113._12_4_ = fVar209;
                fVar216 = fVar216 * fVar216 * fVar216;
                auVar159._0_4_ = (float)local_328._0_4_ * fVar216;
                auVar159._4_4_ = (float)local_328._4_4_ * fVar216;
                auVar159._8_4_ = fStack_320 * fVar216;
                auVar159._12_4_ = fStack_31c * fVar216;
                auVar63 = vfmadd231ps_fma(auVar159,auVar46,auVar113);
                auVar63 = vfmadd231ps_fma(auVar63,auVar48,auVar140);
                auVar63 = vfmadd231ps_fma(auVar63,auVar49,auVar152);
                auVar114._8_8_ = auVar63._0_8_;
                auVar114._0_8_ = auVar63._0_8_;
                auVar63 = vshufpd_avx(auVar63,auVar63,3);
                auVar53 = vshufps_avx(auVar57,auVar57,0x55);
                auVar63 = vsubps_avx(auVar63,auVar114);
                auVar53 = vfmadd213ps_fma(auVar63,auVar53,auVar114);
                fVar195 = auVar53._0_4_;
                auVar63 = vshufps_avx(auVar53,auVar53,0x55);
                auVar115._0_4_ = auVar51._0_4_ * fVar195 + fVar102 * auVar63._0_4_;
                auVar115._4_4_ = auVar51._4_4_ * fVar195 + auVar54._4_4_ * auVar63._4_4_;
                auVar115._8_4_ = auVar51._8_4_ * fVar195 + auVar54._8_4_ * auVar63._8_4_;
                auVar115._12_4_ = auVar51._12_4_ * fVar195 + auVar54._12_4_ * auVar63._12_4_;
                auVar57 = vsubps_avx(auVar57,auVar115);
                auVar63 = vandps_avx512vl(auVar53,auVar249._0_16_);
                auVar53 = vprolq_avx512vl(auVar63,0x20);
                auVar63 = vmaxss_avx(auVar53,auVar63);
                bVar13 = auVar63._0_4_ <= (float)local_338._0_4_;
                if (auVar63._0_4_ < (float)local_338._0_4_) {
                  auVar51 = vucomiss_avx512f(auVar52);
                  if (bVar13) {
                    auVar118 = vucomiss_avx512f(auVar51);
                    auVar252 = ZEXT1664(auVar118);
                    if (bVar13) {
                      vmovshdup_avx(auVar51);
                      auVar118 = vucomiss_avx512f(auVar52);
                      if (bVar13) {
                        auVar54 = vucomiss_avx512f(auVar118);
                        auVar252 = ZEXT1664(auVar54);
                        if (bVar13) {
                          auVar63 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar56 = vinsertps_avx(auVar63,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar63 = vdpps_avx(auVar56,local_188,0x7f);
                          auVar53 = vdpps_avx(auVar56,local_198,0x7f);
                          auVar59 = vdpps_avx(auVar56,local_1a8,0x7f);
                          auVar60 = vdpps_avx(auVar56,local_1b8,0x7f);
                          auVar61 = vdpps_avx(auVar56,local_1c8,0x7f);
                          auVar58 = vdpps_avx(auVar56,local_1d8,0x7f);
                          auVar55 = vdpps_avx(auVar56,local_1e8,0x7f);
                          auVar56 = vdpps_avx(auVar56,local_1f8,0x7f);
                          auVar57 = vsubss_avx512f(auVar54,auVar118);
                          fVar209 = auVar118._0_4_;
                          auVar118 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar61._0_4_)),
                                                     auVar57,auVar63);
                          auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar209)),auVar57
                                                    ,auVar53);
                          auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar209)),auVar57
                                                    ,auVar59);
                          auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar56._0_4_)),auVar57
                                                    ,auVar60);
                          auVar54 = vsubss_avx512f(auVar54,auVar51);
                          auVar191._0_4_ = auVar54._0_4_;
                          fVar102 = auVar191._0_4_ * auVar191._0_4_ * auVar191._0_4_;
                          local_118 = auVar51._0_4_;
                          fVar195 = local_118 * 3.0 * auVar191._0_4_ * auVar191._0_4_;
                          fVar208 = auVar191._0_4_ * local_118 * local_118 * 3.0;
                          fVar224 = local_118 * local_118 * local_118;
                          auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * auVar59._0_4_)),
                                                    ZEXT416((uint)fVar208),auVar53);
                          auVar54 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar195),auVar63);
                          auVar118 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar102),auVar118);
                          fVar216 = auVar118._0_4_;
                          if ((fVar128 <= fVar216) &&
                             (fVar225 = *(float *)(ray + k * 4 + 0x80), fVar216 <= fVar225)) {
                            local_108 = vshufps_avx(auVar51,auVar51,0x55);
                            auVar54 = vsubps_avx512vl(auVar45,local_108);
                            fVar226 = local_108._0_4_;
                            auVar205._0_4_ = fVar226 * (float)local_218._0_4_;
                            fVar227 = local_108._4_4_;
                            auVar205._4_4_ = fVar227 * (float)local_218._4_4_;
                            fVar235 = local_108._8_4_;
                            auVar205._8_4_ = fVar235 * fStack_210;
                            fVar236 = local_108._12_4_;
                            auVar205._12_4_ = fVar236 * fStack_20c;
                            auVar215._0_4_ = fVar226 * (float)local_268._0_4_;
                            auVar215._4_4_ = fVar227 * (float)local_268._4_4_;
                            auVar215._8_4_ = fVar235 * fStack_260;
                            auVar215._12_4_ = fVar236 * fStack_25c;
                            auVar223._0_4_ = fVar226 * (float)local_278._0_4_;
                            auVar223._4_4_ = fVar227 * (float)local_278._4_4_;
                            auVar223._8_4_ = fVar235 * fStack_270;
                            auVar223._12_4_ = fVar236 * fStack_26c;
                            auVar231._0_4_ = fVar226 * (float)local_238._0_4_;
                            auVar231._4_4_ = fVar227 * (float)local_238._4_4_;
                            auVar231._8_4_ = fVar235 * fStack_230;
                            auVar231._12_4_ = fVar236 * fStack_22c;
                            auVar45 = vfmadd231ps_fma(auVar205,auVar54,local_208);
                            auVar51 = vfmadd231ps_fma(auVar215,auVar54,local_248);
                            auVar118 = vfmadd231ps_fma(auVar223,auVar54,local_258);
                            auVar54 = vfmadd231ps_fma(auVar231,auVar54,local_228);
                            auVar45 = vsubps_avx(auVar51,auVar45);
                            auVar51 = vsubps_avx(auVar118,auVar51);
                            auVar118 = vsubps_avx(auVar54,auVar118);
                            auVar232._0_4_ = local_118 * auVar51._0_4_;
                            auVar232._4_4_ = local_118 * auVar51._4_4_;
                            auVar232._8_4_ = local_118 * auVar51._8_4_;
                            auVar232._12_4_ = local_118 * auVar51._12_4_;
                            auVar191._4_4_ = auVar191._0_4_;
                            auVar191._8_4_ = auVar191._0_4_;
                            auVar191._12_4_ = auVar191._0_4_;
                            auVar45 = vfmadd231ps_fma(auVar232,auVar191,auVar45);
                            auVar206._0_4_ = local_118 * auVar118._0_4_;
                            auVar206._4_4_ = local_118 * auVar118._4_4_;
                            auVar206._8_4_ = local_118 * auVar118._8_4_;
                            auVar206._12_4_ = local_118 * auVar118._12_4_;
                            auVar51 = vfmadd231ps_fma(auVar206,auVar191,auVar51);
                            auVar207._0_4_ = local_118 * auVar51._0_4_;
                            auVar207._4_4_ = local_118 * auVar51._4_4_;
                            auVar207._8_4_ = local_118 * auVar51._8_4_;
                            auVar207._12_4_ = local_118 * auVar51._12_4_;
                            auVar45 = vfmadd231ps_fma(auVar207,auVar191,auVar45);
                            auVar16._8_4_ = 0x40400000;
                            auVar16._0_8_ = 0x4040000040400000;
                            auVar16._12_4_ = 0x40400000;
                            auVar45 = vmulps_avx512vl(auVar45,auVar16);
                            pGVar6 = (context->scene->geometries).items[uVar36].ptr;
                            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                              auVar172._0_4_ = fVar224 * (float)local_2b8._0_4_;
                              auVar172._4_4_ = fVar224 * (float)local_2b8._4_4_;
                              auVar172._8_4_ = fVar224 * fStack_2b0;
                              auVar172._12_4_ = fVar224 * fStack_2ac;
                              auVar160._4_4_ = fVar208;
                              auVar160._0_4_ = fVar208;
                              auVar160._8_4_ = fVar208;
                              auVar160._12_4_ = fVar208;
                              auVar51 = vfmadd132ps_fma(auVar160,auVar172,local_2a8);
                              auVar153._4_4_ = fVar195;
                              auVar153._0_4_ = fVar195;
                              auVar153._8_4_ = fVar195;
                              auVar153._12_4_ = fVar195;
                              auVar51 = vfmadd132ps_fma(auVar153,auVar51,local_298);
                              auVar141._4_4_ = fVar102;
                              auVar141._0_4_ = fVar102;
                              auVar141._8_4_ = fVar102;
                              auVar141._12_4_ = fVar102;
                              auVar54 = vfmadd132ps_fma(auVar141,auVar51,local_288);
                              auVar51 = vshufps_avx(auVar54,auVar54,0xc9);
                              auVar118 = vshufps_avx(auVar45,auVar45,0xc9);
                              auVar142._0_4_ = auVar54._0_4_ * auVar118._0_4_;
                              auVar142._4_4_ = auVar54._4_4_ * auVar118._4_4_;
                              auVar142._8_4_ = auVar54._8_4_ * auVar118._8_4_;
                              auVar142._12_4_ = auVar54._12_4_ * auVar118._12_4_;
                              auVar45 = vfmsub231ps_fma(auVar142,auVar45,auVar51);
                              local_128 = auVar45._0_4_;
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                *(float *)(ray + k * 4 + 0x80) = fVar216;
                                uVar108 = vextractps_avx(auVar45,1);
                                *(undefined4 *)(ray + k * 4 + 0xc0) = uVar108;
                                uVar108 = vextractps_avx(auVar45,2);
                                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar108;
                                *(undefined4 *)(ray + k * 4 + 0xe0) = local_128;
                                *(float *)(ray + k * 4 + 0xf0) = local_118;
                                *(float *)(ray + k * 4 + 0x100) = fVar209;
                                *(uint *)(ray + k * 4 + 0x110) = uVar4;
                                *(uint *)(ray + k * 4 + 0x120) = uVar36;
                                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                              }
                              else {
                                auVar51 = vshufps_avx(auVar45,auVar45,0x55);
                                local_138 = vshufps_avx(auVar45,auVar45,0xaa);
                                local_148[0] = (RTCHitN)auVar51[0];
                                local_148[1] = (RTCHitN)auVar51[1];
                                local_148[2] = (RTCHitN)auVar51[2];
                                local_148[3] = (RTCHitN)auVar51[3];
                                local_148[4] = (RTCHitN)auVar51[4];
                                local_148[5] = (RTCHitN)auVar51[5];
                                local_148[6] = (RTCHitN)auVar51[6];
                                local_148[7] = (RTCHitN)auVar51[7];
                                local_148[8] = (RTCHitN)auVar51[8];
                                local_148[9] = (RTCHitN)auVar51[9];
                                local_148[10] = (RTCHitN)auVar51[10];
                                local_148[0xb] = (RTCHitN)auVar51[0xb];
                                local_148[0xc] = (RTCHitN)auVar51[0xc];
                                local_148[0xd] = (RTCHitN)auVar51[0xd];
                                local_148[0xe] = (RTCHitN)auVar51[0xe];
                                local_148[0xf] = (RTCHitN)auVar51[0xf];
                                uStack_124 = local_128;
                                uStack_120 = local_128;
                                uStack_11c = local_128;
                                fStack_114 = local_118;
                                fStack_110 = local_118;
                                fStack_10c = local_118;
                                local_f8 = local_2d8._0_8_;
                                uStack_f0 = local_2d8._8_8_;
                                local_e8 = local_2c8;
                                vpcmpeqd_avx2(ZEXT1632(local_2c8),ZEXT1632(local_2c8));
                                uStack_d4 = context->user->instID[0];
                                local_d8 = uStack_d4;
                                uStack_d0 = uStack_d4;
                                uStack_cc = uStack_d4;
                                uStack_c8 = context->user->instPrimID[0];
                                uStack_c4 = uStack_c8;
                                uStack_c0 = uStack_c8;
                                uStack_bc = uStack_c8;
                                *(float *)(ray + k * 4 + 0x80) = fVar216;
                                local_388 = local_2e8._0_8_;
                                uStack_380 = local_2e8._8_8_;
                                local_378.valid = (int *)&local_388;
                                local_378.geometryUserPtr = pGVar6->userPtr;
                                local_378.context = context->user;
                                local_378.hit = local_148;
                                local_378.N = 4;
                                local_378.ray = (RTCRayN *)ray;
                                if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar6->intersectionFilterN)(&local_378);
                                  auVar247 = ZEXT1664(local_348);
                                  auVar50 = vxorps_avx512vl(auVar52,auVar52);
                                  auVar256 = ZEXT1664(auVar50);
                                  auVar252 = ZEXT464(0x3f800000);
                                  auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar251 = ZEXT3264(auVar69);
                                  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar250 = ZEXT1664(auVar50);
                                  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar249 = ZEXT1664(auVar50);
                                  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar248 = ZEXT1664(auVar50);
                                  auVar50 = vxorps_avx512vl(auVar44,auVar44);
                                  auVar257 = ZEXT1664(auVar50);
                                  auVar69 = vbroadcastss_avx512vl(ZEXT416(2));
                                  auVar50 = auVar69._16_16_;
                                  auVar254 = ZEXT3264(auVar69);
                                }
                                auVar44 = auVar257._0_16_;
                                auVar45 = auVar256._0_16_;
                                auVar26._8_8_ = uStack_380;
                                auVar26._0_8_ = local_388;
                                uVar35 = vptestmd_avx512vl(auVar26,auVar26);
                                if ((uVar35 & 0xf) == 0) {
LAB_01d63e53:
                                  *(float *)(ray + k * 4 + 0x80) = fVar225;
                                }
                                else {
                                  p_Var7 = context->args->filter;
                                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var7)(&local_378);
                                    auVar247 = ZEXT1664(local_348);
                                    auVar50 = vxorps_avx512vl(auVar45,auVar45);
                                    auVar256 = ZEXT1664(auVar50);
                                    auVar252 = ZEXT464(0x3f800000);
                                    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar251 = ZEXT3264(auVar69);
                                    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar250 = ZEXT1664(auVar50);
                                    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar249 = ZEXT1664(auVar50);
                                    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                    auVar248 = ZEXT1664(auVar50);
                                    auVar50 = vxorps_avx512vl(auVar44,auVar44);
                                    auVar257 = ZEXT1664(auVar50);
                                    auVar69 = vbroadcastss_avx512vl(ZEXT416(2));
                                    auVar50 = auVar69._16_16_;
                                    auVar254 = ZEXT3264(auVar69);
                                  }
                                  auVar27._8_8_ = uStack_380;
                                  auVar27._0_8_ = local_388;
                                  uVar35 = vptestmd_avx512vl(auVar27,auVar27);
                                  uVar35 = uVar35 & 0xf;
                                  bVar28 = (byte)uVar35;
                                  if (bVar28 == 0) goto LAB_01d63e53;
                                  iVar101 = *(int *)(local_378.hit + 4);
                                  iVar255 = *(int *)(local_378.hit + 8);
                                  iVar25 = *(int *)(local_378.hit + 0xc);
                                  bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                                  bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
                                  bVar11 = SUB81(uVar35 >> 3,0);
                                  *(uint *)(local_378.ray + 0xc0) =
                                       (uint)(bVar28 & 1) * *(int *)local_378.hit |
                                       (uint)!(bool)(bVar28 & 1) * *(int *)(local_378.ray + 0xc0);
                                  *(uint *)(local_378.ray + 0xc4) =
                                       (uint)bVar13 * iVar101 |
                                       (uint)!bVar13 * *(int *)(local_378.ray + 0xc4);
                                  *(uint *)(local_378.ray + 200) =
                                       (uint)bVar10 * iVar255 |
                                       (uint)!bVar10 * *(int *)(local_378.ray + 200);
                                  *(uint *)(local_378.ray + 0xcc) =
                                       (uint)bVar11 * iVar25 |
                                       (uint)!bVar11 * *(int *)(local_378.ray + 0xcc);
                                  iVar101 = *(int *)(local_378.hit + 0x14);
                                  iVar255 = *(int *)(local_378.hit + 0x18);
                                  iVar25 = *(int *)(local_378.hit + 0x1c);
                                  bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                                  bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
                                  bVar11 = SUB81(uVar35 >> 3,0);
                                  *(uint *)(local_378.ray + 0xd0) =
                                       (uint)(bVar28 & 1) * *(int *)(local_378.hit + 0x10) |
                                       (uint)!(bool)(bVar28 & 1) * *(int *)(local_378.ray + 0xd0);
                                  *(uint *)(local_378.ray + 0xd4) =
                                       (uint)bVar13 * iVar101 |
                                       (uint)!bVar13 * *(int *)(local_378.ray + 0xd4);
                                  *(uint *)(local_378.ray + 0xd8) =
                                       (uint)bVar10 * iVar255 |
                                       (uint)!bVar10 * *(int *)(local_378.ray + 0xd8);
                                  *(uint *)(local_378.ray + 0xdc) =
                                       (uint)bVar11 * iVar25 |
                                       (uint)!bVar11 * *(int *)(local_378.ray + 0xdc);
                                  iVar101 = *(int *)(local_378.hit + 0x24);
                                  iVar255 = *(int *)(local_378.hit + 0x28);
                                  iVar25 = *(int *)(local_378.hit + 0x2c);
                                  bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                                  bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
                                  bVar11 = SUB81(uVar35 >> 3,0);
                                  *(uint *)(local_378.ray + 0xe0) =
                                       (uint)(bVar28 & 1) * *(int *)(local_378.hit + 0x20) |
                                       (uint)!(bool)(bVar28 & 1) * *(int *)(local_378.ray + 0xe0);
                                  *(uint *)(local_378.ray + 0xe4) =
                                       (uint)bVar13 * iVar101 |
                                       (uint)!bVar13 * *(int *)(local_378.ray + 0xe4);
                                  *(uint *)(local_378.ray + 0xe8) =
                                       (uint)bVar10 * iVar255 |
                                       (uint)!bVar10 * *(int *)(local_378.ray + 0xe8);
                                  *(uint *)(local_378.ray + 0xec) =
                                       (uint)bVar11 * iVar25 |
                                       (uint)!bVar11 * *(int *)(local_378.ray + 0xec);
                                  iVar101 = *(int *)(local_378.hit + 0x34);
                                  iVar255 = *(int *)(local_378.hit + 0x38);
                                  iVar25 = *(int *)(local_378.hit + 0x3c);
                                  bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                                  bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
                                  bVar11 = SUB81(uVar35 >> 3,0);
                                  *(uint *)(local_378.ray + 0xf0) =
                                       (uint)(bVar28 & 1) * *(int *)(local_378.hit + 0x30) |
                                       (uint)!(bool)(bVar28 & 1) * *(int *)(local_378.ray + 0xf0);
                                  *(uint *)(local_378.ray + 0xf4) =
                                       (uint)bVar13 * iVar101 |
                                       (uint)!bVar13 * *(int *)(local_378.ray + 0xf4);
                                  *(uint *)(local_378.ray + 0xf8) =
                                       (uint)bVar10 * iVar255 |
                                       (uint)!bVar10 * *(int *)(local_378.ray + 0xf8);
                                  *(uint *)(local_378.ray + 0xfc) =
                                       (uint)bVar11 * iVar25 |
                                       (uint)!bVar11 * *(int *)(local_378.ray + 0xfc);
                                  iVar101 = *(int *)(local_378.hit + 0x44);
                                  iVar255 = *(int *)(local_378.hit + 0x48);
                                  iVar25 = *(int *)(local_378.hit + 0x4c);
                                  bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                                  bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
                                  bVar11 = SUB81(uVar35 >> 3,0);
                                  *(uint *)(local_378.ray + 0x100) =
                                       (uint)(bVar28 & 1) * *(int *)(local_378.hit + 0x40) |
                                       (uint)!(bool)(bVar28 & 1) * *(int *)(local_378.ray + 0x100);
                                  *(uint *)(local_378.ray + 0x104) =
                                       (uint)bVar13 * iVar101 |
                                       (uint)!bVar13 * *(int *)(local_378.ray + 0x104);
                                  *(uint *)(local_378.ray + 0x108) =
                                       (uint)bVar10 * iVar255 |
                                       (uint)!bVar10 * *(int *)(local_378.ray + 0x108);
                                  *(uint *)(local_378.ray + 0x10c) =
                                       (uint)bVar11 * iVar25 |
                                       (uint)!bVar11 * *(int *)(local_378.ray + 0x10c);
                                  auVar45 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                                (local_378.hit + 0x50));
                                  *(undefined1 (*) [16])(local_378.ray + 0x110) = auVar45;
                                  auVar45 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                                (local_378.hit + 0x60));
                                  *(undefined1 (*) [16])(local_378.ray + 0x120) = auVar45;
                                  auVar45 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                                (local_378.hit + 0x70));
                                  *(undefined1 (*) [16])(local_378.ray + 0x130) = auVar45;
                                  auVar45 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                                (local_378.hit + 0x80));
                                  *(undefined1 (*) [16])(local_378.ray + 0x140) = auVar45;
                                }
                                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar253 = ZEXT1664(auVar45);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar34 = lVar34 + -1;
              } while (lVar34 != 0);
            }
          }
          else {
            auVar45 = vxorps_avx512vl(ZEXT416(5),auVar52);
            auVar256 = ZEXT1664(auVar45);
          }
        }
      }
    } while (bVar12);
    auVar50 = vinsertps_avx512f(auVar40,auVar43,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }